

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__decode_samples_with_residual__rice__scalar
                    (ma_dr_flac_bs *bs,ma_uint32 bitsPerSample,ma_uint32 count,ma_uint8 riceParam,
                    ma_uint32 lpcOrder,ma_int32 lpcShift,ma_uint32 lpcPrecision,
                    ma_int32 *coefficients,ma_int32 *pSamplesOut)

{
  int *piVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ma_bool32 mVar10;
  byte bVar11;
  byte bVar12;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ushort uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  ma_uint32 mVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  int iVar40;
  uint unaff_R14D;
  int iVar41;
  uint uVar42;
  int iVar43;
  ma_dr_flac_cache_t mVar44;
  ma_dr_flac_cache_t mVar45;
  bool bVar46;
  ulong local_120;
  uint local_118;
  uint local_10c;
  uint local_108;
  uint local_104;
  ulong local_100;
  uint local_f8;
  uint local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  uint local_88;
  ulong local_70;
  byte bVar13;
  
  uVar8 = (uint)riceParam;
  if (lpcOrder == 0) {
    if (count == 0) {
      return 1;
    }
    uVar42 = 0x3f - riceParam;
    uVar27 = 0;
    do {
      uVar39 = bs->cache;
      mVar26 = bs->consumedBits;
      if (ma_dr_flac__gIsLZCNTSupported == 0) {
        if (uVar39 == 0) {
          uVar28 = 0x40;
        }
        else {
          if (uVar39 < 0x1000000000000000) {
            bVar46 = uVar39 >> 0x20 == 0;
            uVar28 = uVar39 << 0x20;
            if (!bVar46) {
              uVar28 = uVar39;
            }
            iVar21 = (uint)bVar46 * 0x20;
            iVar7 = iVar21 + 0x10;
            uVar5 = uVar28 << 0x10;
            if (0xffffffffffff < uVar28) {
              iVar7 = iVar21;
              uVar5 = uVar28;
            }
            iVar21 = iVar7 + 8;
            uVar28 = uVar5 << 8;
            if (0xffffffffffffff < uVar5) {
              iVar21 = iVar7;
              uVar28 = uVar5;
            }
            iVar7 = iVar21 + 4;
            uVar5 = uVar28 << 4;
            if (0xfffffffffffffff < uVar28) {
              iVar7 = iVar21;
              uVar5 = uVar28;
            }
            iVar7 = iVar7 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                    (uVar5 >> 0x3c) * 4);
          }
          else {
            iVar7 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                            (uVar39 >> 0x3c) * 4);
          }
          uVar28 = (ulong)(iVar7 - 1);
        }
      }
      else {
        uVar28 = LZCOUNT(uVar39);
      }
      uVar30 = (uint)uVar28;
      if (uVar30 < 0x40) {
LAB_0018d5d9:
        local_120 = uVar28;
        uVar39 = uVar39 << ((byte)uVar30 & 0x3f);
        uVar30 = mVar26 + uVar30;
        uVar35 = (uint)(uVar39 >> ((byte)uVar42 & 0x3f));
        if (uVar42 < uVar30) {
          uVar23 = uVar30 - uVar42;
          uVar31 = bs->nextL2Line;
          if ((ulong)uVar31 < 0x200) {
            uVar17 = bs->crc16;
            uVar30 = (uint)uVar17;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar44 = bs->crc16Cache;
              uVar16 = (uint)mVar44;
              uVar3 = (ushort)(mVar44 >> 0x30);
              uVar4 = (uint)(mVar44 >> 0x10);
              uVar2 = (uint)(mVar44 >> 0x18);
              uVar15 = (uint)(mVar44 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar15 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar17 >> 8) ^
                                                     (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar3 ^
                                                    ((uint)uVar17 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar17 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar15 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar3 ^
                                                              ((uint)uVar17 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar17 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar15 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar17 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar3 ^
                                                                            ((uint)uVar17 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff])
                                     >> 8 & 0xff ^ uVar2 & 0xff] << 8 ^ uVar16 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar15 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar3 ^
                                                               ((uint)uVar17 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar17 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar15 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar17 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar3 ^
                                                                             ((uint)uVar17 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                      << 8 ^ (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar15 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar17 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar3 ^
                                                                        ((uint)uVar17 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar15 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar3 ^
                                                                           ((uint)uVar17 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar15 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar17 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar3 ^
                                                                  ((uint)uVar17 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar17 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar2 & 0xff])
                                     >> 8 & 0xff ^ uVar4 & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar15 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar3 ^
                                                                 ((uint)uVar17 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar17 >> 8) ^
                                                                        (uint)(byte)(mVar44 >> 0x38)
                                                                       ]) >> 8 & 0xff) & 0xff] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [(uVar15 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar17 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar3 ^
                                                                         ((uint)uVar17 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar15 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar17 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar3 ^
                                                                             ((uint)uVar17 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar15 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar3 ^
                                                                           ((uint)uVar17 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar15 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar17 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar3 ^
                                                                  ((uint)uVar17 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar17 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar2 & 0xff])
                                       >> 8 & 0xff ^ uVar4 & 0xffff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar15 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar17 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)uVar3 ^
                                                            ((uint)uVar17 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar17 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar15 ^ ((uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar3 ^
                                                                              ((uint)uVar17 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar15 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar17 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar3 ^
                                                                  ((uint)uVar17 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar17 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar2 & 0xff]
                                      << 8 ^ uVar16 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar15 ^ ((uint)ma_dr_flac__crc16_table
                                                                      [((uint)uVar3 ^
                                                                       ((uint)uVar17 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(uVar17 >> 8) ^
                                                                              (uint)(byte)(mVar44 >>
                                                                                          0x38)]) >>
                                                                       8 & 0xff) & 0xff] << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uVar15 >> 8 ^
                                                                      ((uint)ma_dr_flac__crc16_table
                                                                             [(uint)(uVar17 >> 8) ^
                                                                              (uint)(byte)(mVar44 >>
                                                                                          0x38)] <<
                                                                       8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar3 ^
                                                   ((uint)uVar17 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar17 >> 8) ^
                                                          (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff
                                                   ) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar15 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar17 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar3 ^
                                                                        ((uint)uVar17 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar15 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar3 ^
                                                                           ((uint)uVar17 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar15 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar17 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar3 ^
                                                                  ((uint)uVar17 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar17 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar2 & 0xff])
                                             >> 8 & 0xff ^ uVar4 & 0xffff) & 0xff]) >> 8 & 0xff]) >>
                              8 & 0xff ^ uVar16) & 0xff];
                break;
              case 1:
                uVar30 = (uint)(ushort)(uVar17 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar3 ^ uVar17 >> 8) & 0xff]
                                       );
              case 2:
                uVar30 = (uint)(ushort)((ushort)(uVar30 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar15 ^ uVar30) >> 8 & 0xff]);
              case 3:
                uVar30 = (uint)(ushort)((ushort)(uVar30 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar15 ^ uVar30 >> 8) & 0xff]);
              case 4:
                uVar30 = (uint)(ushort)((ushort)(uVar30 << 8) ^
                                       ma_dr_flac__crc16_table[uVar30 >> 8 ^ uVar2 & 0xff]);
              case 5:
                uVar30 = (uint)(ushort)((ushort)(uVar30 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar30 >> 8 ^ uVar4 & 0xffff) & 0xff]);
              case 6:
                uVar17 = (ushort)(uVar30 << 8) ^
                         ma_dr_flac__crc16_table[(uVar16 ^ uVar30) >> 8 & 0xff];
              case 7:
                uVar17 = uVar17 << 8 ^ ma_dr_flac__crc16_table[(uVar16 ^ uVar17 >> 8) & 0xff];
                goto LAB_0018d843;
              }
            }
            else {
LAB_0018d843:
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar31 + 1;
            uVar39 = bs->cacheL2[uVar31];
            uVar28 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                     (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                     (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                     (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38;
            bs->crc16Cache = uVar28;
            uVar30 = uVar23;
LAB_0018d86f:
            uVar39 = uVar28 << ((byte)uVar23 & 0x3f);
            unaff_R14D = uVar35 | (uint)(uVar28 >> (-(byte)uVar23 & 0x3f));
            bVar46 = true;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
            }
            else {
              if ((ulong)uVar23 <= 0x40 - (ulong)bs->consumedBits) {
                uVar28 = bs->cache;
                uVar30 = bs->consumedBits + uVar23;
                goto LAB_0018d86f;
              }
              bVar46 = false;
            }
          }
          bVar6 = true;
          if (!bVar46) goto LAB_0018d8b1;
        }
        else {
          uVar39 = uVar39 << ((byte)(uVar8 + 1) & 0x3f);
          uVar30 = uVar30 + uVar8 + 1;
          unaff_R14D = uVar35;
        }
        bs->cache = uVar39;
        bs->consumedBits = uVar30;
        bVar6 = false;
      }
      else {
        uVar35 = 0x40 - mVar26;
        do {
          uVar30 = (uint)uVar28;
          uVar31 = bs->nextL2Line;
          if ((ulong)uVar31 < 0x200) {
            uVar17 = bs->crc16;
            uVar30 = (uint)uVar17;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar44 = bs->crc16Cache;
              uVar15 = (uint)mVar44;
              uVar3 = (ushort)(mVar44 >> 0x30);
              uVar2 = (uint)(mVar44 >> 0x10);
              uVar23 = (uint)(mVar44 >> 0x18);
              uVar4 = (uint)(mVar44 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar4 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar17 >> 8) ^
                                                     (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar3 ^
                                                    ((uint)uVar17 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar17 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar3 ^
                                                             ((uint)uVar17 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar17 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar4 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar17 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar3 ^
                                                                        ((uint)uVar17 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff])
                                     >> 8 & 0xff ^ uVar23 & 0xff] << 8 ^ uVar15 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar3 ^
                                                              ((uint)uVar17 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar17 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar4 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar17 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar3 ^
                                                                            ((uint)uVar17 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                      << 8 ^ (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar4 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar17 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar3 ^
                                                                        ((uint)uVar17 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar3 ^
                                                                          ((uint)uVar17 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar17 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar3 ^
                                                                  ((uint)uVar17 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar17 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar23 & 0xff]
                                     ) >> 8 & 0xff ^ uVar2 & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar3 ^
                                                                ((uint)uVar17 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar17 >> 8) ^
                                                                       (uint)(byte)(mVar44 >> 0x38)]
                                                                ) >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar4 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar17 >> 8) ^
                                                                       (uint)(byte)(mVar44 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar3 ^
                                                                              ((uint)uVar17 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar4 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar17 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar3 ^
                                                                             ((uint)uVar17 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar3 ^
                                                                          ((uint)uVar17 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar17 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar3 ^
                                                                  ((uint)uVar17 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar17 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar23 & 0xff]
                                       ) >> 8 & 0xff ^ uVar2 & 0xffff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar4 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar17 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)uVar3 ^
                                                            ((uint)uVar17 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar17 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar3 ^
                                                                             ((uint)uVar17 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar17 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar3 ^
                                                                  ((uint)uVar17 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar17 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar23 & 0xff]
                                      << 8 ^ uVar15 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)uVar3 ^
                                                                      ((uint)uVar17 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(uVar17 >> 8) ^
                                                                             (uint)(byte)(mVar44 >>
                                                                                         0x38)]) >>
                                                                      8 & 0xff) & 0xff] << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uVar4 >> 8 ^
                                                                     ((uint)ma_dr_flac__crc16_table
                                                                            [(uint)(uVar17 >> 8) ^
                                                                             (uint)(byte)(mVar44 >>
                                                                                         0x38)] << 8
                                                                     ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar3 ^
                                                                              ((uint)uVar17 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [((uint)ma_dr_flac__crc16_table
                                                                   [(uVar4 >> 8 ^
                                                                    ((uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar17 >> 8) ^
                                                                            (uint)(byte)(mVar44 >>
                                                                                        0x38)] << 8
                                                                    ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar3 ^
                                                                             ((uint)uVar17 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar3 ^
                                                                          ((uint)uVar17 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar17 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar17 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar3 ^
                                                                  ((uint)uVar17 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar17 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar23 & 0xff]
                                             ) >> 8 & 0xff ^ uVar2 & 0xffff) & 0xff]) >> 8 & 0xff])
                              >> 8 & 0xff ^ uVar15) & 0xff];
                break;
              case 1:
                uVar30 = (uint)(ushort)(uVar17 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar3 ^ uVar17 >> 8) & 0xff]
                                       );
              case 2:
                uVar30 = (uint)(ushort)((ushort)(uVar30 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar4 ^ uVar30) >> 8 & 0xff]);
              case 3:
                uVar30 = (uint)(ushort)((ushort)(uVar30 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar4 ^ uVar30 >> 8) & 0xff]);
              case 4:
                uVar30 = (uint)(ushort)((ushort)(uVar30 << 8) ^
                                       ma_dr_flac__crc16_table[uVar30 >> 8 ^ uVar23 & 0xff]);
              case 5:
                uVar30 = (uint)(ushort)((ushort)(uVar30 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar30 >> 8 ^ uVar2 & 0xffff) & 0xff]);
              case 6:
                uVar17 = (ushort)(uVar30 << 8) ^
                         ma_dr_flac__crc16_table[(uVar15 ^ uVar30) >> 8 & 0xff];
              case 7:
                uVar17 = uVar17 << 8 ^ ma_dr_flac__crc16_table[(uVar15 ^ uVar17 >> 8) & 0xff];
                goto LAB_0018d4b8;
              }
            }
            else {
LAB_0018d4b8:
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar31 + 1;
            uVar39 = bs->cacheL2[uVar31];
            uVar39 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                     (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                     (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                     (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38;
            bs->crc16Cache = uVar39;
            mVar26 = 0;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
              goto LAB_0018d5cf;
            }
            uVar39 = bs->cache;
            mVar26 = bs->consumedBits;
          }
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            if (uVar39 == 0) {
              uVar28 = 0x40;
            }
            else {
              if (uVar39 < 0x1000000000000000) {
                bVar46 = uVar39 >> 0x20 == 0;
                uVar28 = uVar39 << 0x20;
                if (!bVar46) {
                  uVar28 = uVar39;
                }
                iVar21 = (uint)bVar46 * 0x20;
                iVar7 = iVar21 + 0x10;
                uVar5 = uVar28 << 0x10;
                if (0xffffffffffff < uVar28) {
                  iVar7 = iVar21;
                  uVar5 = uVar28;
                }
                iVar21 = iVar7 + 8;
                uVar28 = uVar5 << 8;
                if (0xffffffffffffff < uVar5) {
                  iVar21 = iVar7;
                  uVar28 = uVar5;
                }
                iVar7 = iVar21 + 4;
                uVar5 = uVar28 << 4;
                if (0xfffffffffffffff < uVar28) {
                  iVar7 = iVar21;
                  uVar5 = uVar28;
                }
                iVar7 = iVar7 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar5 >> 0x3c) * 4);
              }
              else {
                iVar7 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                (uVar39 >> 0x3c) * 4);
              }
              uVar28 = (ulong)(iVar7 - 1);
            }
          }
          else {
            uVar28 = LZCOUNT(uVar39);
          }
          uVar30 = (uint)uVar28;
          uVar35 = uVar35 + uVar30;
        } while (0x3f < uVar30);
        bVar46 = true;
        local_120 = (ulong)uVar35;
LAB_0018d5cf:
        bVar6 = true;
        uVar28 = local_120;
        if (bVar46) goto LAB_0018d5d9;
      }
LAB_0018d8b1:
      if (bVar6) {
        return 0;
      }
      uVar30 = (uint)local_120 << (riceParam & 0x1f) |
               unaff_R14D & ~(uint)(-1L << (riceParam & 0x3f));
      unaff_R14D = uVar30 >> 1 ^ *(uint *)(&DAT_0019dc58 + (ulong)(uVar30 & 1) * 4);
      pSamplesOut[uVar27] = unaff_R14D;
      uVar27 = uVar27 + 1;
      if (uVar27 == count) {
        return 1;
      }
    } while( true );
  }
  uVar30 = count & 0xfffffffc;
  local_70 = (ulong)uVar30;
  piVar1 = pSamplesOut + local_70;
  uVar42 = 0x1f;
  if (lpcOrder != 0) {
    for (; lpcOrder >> uVar42 == 0; uVar42 = uVar42 - 1) {
    }
  }
  uVar35 = ~(uint)(-1L << (riceParam & 0x3f));
  bVar11 = (byte)lpcShift;
  if (((bitsPerSample + lpcPrecision) - (uVar42 ^ 0x1f)) + 0x20 < 0x21) {
    if (uVar30 != 0) {
      iVar7 = uVar8 + 1;
      uVar8 = 0x3f - uVar8;
      local_f8 = 0;
      local_f0 = 0;
      local_118 = 0;
      local_120._0_4_ = 0;
      local_10c = 0;
      local_108 = 0;
      local_104 = 0;
      local_100 = 0;
      do {
        uVar27 = bs->cache;
        mVar26 = bs->consumedBits;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar27 == 0) {
            uVar39 = 0x40;
          }
          else {
            if (uVar27 < 0x1000000000000000) {
              bVar46 = uVar27 >> 0x20 == 0;
              uVar39 = uVar27 << 0x20;
              if (!bVar46) {
                uVar39 = uVar27;
              }
              iVar20 = (uint)bVar46 * 0x20;
              iVar21 = iVar20 + 0x10;
              uVar28 = uVar39 << 0x10;
              if (0xffffffffffff < uVar39) {
                iVar21 = iVar20;
                uVar28 = uVar39;
              }
              iVar20 = iVar21 + 8;
              uVar39 = uVar28 << 8;
              if (0xffffffffffffff < uVar28) {
                iVar20 = iVar21;
                uVar39 = uVar28;
              }
              iVar21 = iVar20 + 4;
              uVar28 = uVar39 << 4;
              if (0xfffffffffffffff < uVar39) {
                iVar21 = iVar20;
                uVar28 = uVar39;
              }
              iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar28 >> 0x3c) * 4);
            }
            else {
              iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar27 >> 0x3c) * 4);
            }
            uVar39 = (ulong)(iVar21 - 1);
          }
        }
        else {
          uVar39 = LZCOUNT(uVar27);
        }
        uVar42 = (uint)uVar39;
        bVar12 = (byte)uVar8;
        bVar13 = (byte)iVar7;
        if (uVar42 < 0x40) {
LAB_0018ae6b:
          local_100 = uVar39;
          uVar27 = uVar27 << ((byte)uVar42 & 0x3f);
          uVar42 = mVar26 + uVar42;
          if (uVar8 < uVar42) {
            uVar39 = uVar27 >> (bVar12 & 0x3f);
            uVar23 = uVar42 - uVar8;
            uVar31 = bs->nextL2Line;
            if ((ulong)uVar31 < 0x200) {
              mVar26 = bs->crc16CacheIgnoredBytes;
              if (mVar26 == 0) {
                mVar44 = bs->crc16Cache;
                uVar42 = (uint)(mVar44 >> 0x20);
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar42 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(bs->crc16 >> 8) ^
                                                     (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)(ushort)(mVar44 >> 0x30) ^
                                                    ((uint)bs->crc16 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)(ushort)(mVar44 >> 0x30) ^
                                                              ((uint)bs->crc16 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar42 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                           ]) >> 8 & 0xff ^ (uint)(mVar44 >> 0x18) & 0xff] << 8 ^
                              (uint)mVar44 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                 ((uint)bs->crc16 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(bs->crc16 >> 8) ^
                                                                        (uint)(byte)(mVar44 >> 0x38)
                                                                       ]) >> 8 & 0xff) & 0xff] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [(uVar42 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)(ushort)(mVar44 >>
                                                                                        0x30) ^
                                                                         ((uint)bs->crc16 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                      (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                             [((uint)(ushort)(mVar44
                                                                                             >> 0x30
                                                  ) ^ ((uint)bs->crc16 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                             (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff])
                              >> 8 & 0xff ^ (uint)mVar44) & 0xff];
              }
              else {
                uVar17 = bs->crc16;
                uVar42 = (uint)uVar17;
                if (mVar26 - 1 < 7) {
                  mVar44 = bs->crc16Cache;
                  uVar2 = (uint)(mVar44 >> 0x20);
                  switch(mVar26) {
                  case 1:
                    uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]
                                           );
                  case 2:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                  case 3:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                  case 4:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                  case 5:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff])
                    ;
                  case 6:
                    uVar17 = (ushort)(uVar42 << 8) ^
                             ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                  case 7:
                    uVar17 = uVar17 << 8 ^
                             ma_dr_flac__crc16_table
                             [((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                  }
                }
                bs->crc16 = uVar17;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar31 + 1;
              uVar27 = bs->cacheL2[uVar31];
              uVar28 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
              bs->crc16Cache = uVar28;
              uVar42 = uVar23;
LAB_0018b0eb:
              uVar27 = uVar28 << ((byte)uVar23 & 0x3f);
              local_120._0_4_ = (uint)uVar39 | (uint)(uVar28 >> (-(byte)uVar23 & 0x3f));
              bVar46 = true;
            }
            else {
              mVar10 = ma_dr_flac__reload_cache(bs);
              if (mVar10 == 0) {
                bVar46 = false;
              }
              else {
                if ((ulong)uVar23 <= 0x40 - (ulong)bs->consumedBits) {
                  uVar28 = bs->cache;
                  uVar42 = bs->consumedBits + uVar23;
                  goto LAB_0018b0eb;
                }
                bVar46 = false;
              }
            }
            bVar6 = true;
            if (!bVar46) goto LAB_0018b117;
          }
          else {
            local_120._0_4_ = (uint)(uVar27 >> (bVar12 & 0x3f));
            uVar27 = uVar27 << (bVar13 & 0x3f);
            uVar42 = uVar42 + iVar7;
          }
          bs->cache = uVar27;
          bs->consumedBits = uVar42;
          bVar6 = false;
        }
        else {
          uVar31 = 0x40 - mVar26;
          do {
            uVar42 = (uint)uVar39;
            uVar23 = bs->nextL2Line;
            if ((ulong)uVar23 < 0x200) {
              mVar26 = bs->crc16CacheIgnoredBytes;
              if (mVar26 == 0) {
                mVar44 = bs->crc16Cache;
                uVar42 = (uint)(mVar44 >> 0x20);
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar42 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(bs->crc16 >> 8) ^
                                                     (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)(ushort)(mVar44 >> 0x30) ^
                                                    ((uint)bs->crc16 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)(ushort)(mVar44 >> 0x30) ^
                                                              ((uint)bs->crc16 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar42 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                           ]) >> 8 & 0xff ^ (uint)(mVar44 >> 0x18) & 0xff] << 8 ^
                              (uint)mVar44 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                 ((uint)bs->crc16 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(bs->crc16 >> 8) ^
                                                                        (uint)(byte)(mVar44 >> 0x38)
                                                                       ]) >> 8 & 0xff) & 0xff] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [(uVar42 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)(ushort)(mVar44 >>
                                                                                        0x30) ^
                                                                         ((uint)bs->crc16 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                      (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                             [((uint)(ushort)(mVar44
                                                                                             >> 0x30
                                                  ) ^ ((uint)bs->crc16 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                             (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff])
                              >> 8 & 0xff ^ (uint)mVar44) & 0xff];
              }
              else {
                uVar17 = bs->crc16;
                uVar42 = (uint)uVar17;
                if (mVar26 - 1 < 7) {
                  mVar44 = bs->crc16Cache;
                  uVar2 = (uint)(mVar44 >> 0x20);
                  switch(mVar26) {
                  case 1:
                    uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]
                                           );
                  case 2:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                  case 3:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                  case 4:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                  case 5:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff])
                    ;
                  case 6:
                    uVar17 = (ushort)(uVar42 << 8) ^
                             ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                  case 7:
                    uVar17 = uVar17 << 8 ^
                             ma_dr_flac__crc16_table
                             [(ulong)((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                  }
                }
                bs->crc16 = uVar17;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar23 + 1;
              uVar27 = bs->cacheL2[uVar23];
              uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
              bs->crc16Cache = uVar27;
              mVar26 = 0;
            }
            else {
              mVar10 = ma_dr_flac__reload_cache(bs);
              if (mVar10 == 0) {
                bVar46 = false;
                goto LAB_0018ae61;
              }
              uVar27 = bs->cache;
              mVar26 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar27 == 0) {
                uVar39 = 0x40;
              }
              else {
                if (uVar27 < 0x1000000000000000) {
                  bVar46 = uVar27 >> 0x20 == 0;
                  uVar39 = uVar27 << 0x20;
                  if (!bVar46) {
                    uVar39 = uVar27;
                  }
                  iVar20 = (uint)bVar46 * 0x20;
                  iVar21 = iVar20 + 0x10;
                  uVar28 = uVar39 << 0x10;
                  if (0xffffffffffff < uVar39) {
                    iVar21 = iVar20;
                    uVar28 = uVar39;
                  }
                  iVar20 = iVar21 + 8;
                  uVar39 = uVar28 << 8;
                  if (0xffffffffffffff < uVar28) {
                    iVar20 = iVar21;
                    uVar39 = uVar28;
                  }
                  iVar21 = iVar20 + 4;
                  uVar28 = uVar39 << 4;
                  if (0xfffffffffffffff < uVar39) {
                    iVar21 = iVar20;
                    uVar28 = uVar39;
                  }
                  iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar28 >> 0x3c) * 4);
                }
                else {
                  iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar27 >> 0x3c) * 4);
                }
                uVar39 = (ulong)(iVar21 - 1);
              }
            }
            else {
              uVar39 = LZCOUNT(uVar27);
            }
            uVar42 = (uint)uVar39;
            uVar31 = uVar31 + uVar42;
          } while (0x3f < uVar42);
          bVar46 = true;
          local_100 = (ulong)uVar31;
LAB_0018ae61:
          bVar6 = true;
          uVar39 = local_100;
          if (bVar46) goto LAB_0018ae6b;
        }
LAB_0018b117:
        if (bVar6) {
          return 0;
        }
        uVar27 = bs->cache;
        mVar26 = bs->consumedBits;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar27 == 0) {
            uVar39 = 0x40;
          }
          else {
            if (uVar27 < 0x1000000000000000) {
              bVar46 = uVar27 >> 0x20 == 0;
              uVar39 = uVar27 << 0x20;
              if (!bVar46) {
                uVar39 = uVar27;
              }
              iVar20 = (uint)bVar46 * 0x20;
              iVar21 = iVar20 + 0x10;
              uVar28 = uVar39 << 0x10;
              if (0xffffffffffff < uVar39) {
                iVar21 = iVar20;
                uVar28 = uVar39;
              }
              iVar20 = iVar21 + 8;
              uVar39 = uVar28 << 8;
              if (0xffffffffffffff < uVar28) {
                iVar20 = iVar21;
                uVar39 = uVar28;
              }
              iVar21 = iVar20 + 4;
              uVar28 = uVar39 << 4;
              if (0xfffffffffffffff < uVar39) {
                iVar21 = iVar20;
                uVar28 = uVar39;
              }
              iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar28 >> 0x3c) * 4);
            }
            else {
              iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar27 >> 0x3c) * 4);
            }
            uVar39 = (ulong)(iVar21 - 1);
          }
        }
        else {
          uVar39 = LZCOUNT(uVar27);
        }
        uVar42 = (uint)uVar39;
        uVar31 = uVar42;
        if (uVar42 < 0x40) {
LAB_0018b51d:
          local_104 = uVar31;
          uVar27 = uVar27 << ((byte)uVar42 & 0x3f);
          uVar42 = mVar26 + uVar42;
          if (uVar8 < uVar42) {
            uVar39 = uVar27 >> (bVar12 & 0x3f);
            uVar23 = uVar42 - uVar8;
            uVar31 = bs->nextL2Line;
            if ((ulong)uVar31 < 0x200) {
              mVar26 = bs->crc16CacheIgnoredBytes;
              if (mVar26 == 0) {
                mVar44 = bs->crc16Cache;
                uVar42 = (uint)(mVar44 >> 0x20);
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar42 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(bs->crc16 >> 8) ^
                                                     (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)(ushort)(mVar44 >> 0x30) ^
                                                    ((uint)bs->crc16 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)(ushort)(mVar44 >> 0x30) ^
                                                              ((uint)bs->crc16 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar42 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                           ]) >> 8 & 0xff ^ (uint)(mVar44 >> 0x18) & 0xff] << 8 ^
                              (uint)mVar44 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                 ((uint)bs->crc16 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(bs->crc16 >> 8) ^
                                                                        (uint)(byte)(mVar44 >> 0x38)
                                                                       ]) >> 8 & 0xff) & 0xff] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [(uVar42 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)(ushort)(mVar44 >>
                                                                                        0x30) ^
                                                                         ((uint)bs->crc16 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                      (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                             [((uint)(ushort)(mVar44
                                                                                             >> 0x30
                                                  ) ^ ((uint)bs->crc16 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                             (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff])
                              >> 8 & 0xff ^ (uint)mVar44) & 0xff];
              }
              else {
                uVar17 = bs->crc16;
                uVar42 = (uint)uVar17;
                if (mVar26 - 1 < 7) {
                  mVar44 = bs->crc16Cache;
                  uVar2 = (uint)(mVar44 >> 0x20);
                  switch(mVar26) {
                  case 1:
                    uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]
                                           );
                  case 2:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                  case 3:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                  case 4:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                  case 5:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff])
                    ;
                  case 6:
                    uVar17 = (ushort)(uVar42 << 8) ^
                             ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                  case 7:
                    uVar17 = uVar17 << 8 ^
                             ma_dr_flac__crc16_table
                             [((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                  }
                }
                bs->crc16 = uVar17;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar31 + 1;
              uVar27 = bs->cacheL2[uVar31];
              uVar28 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
              bs->crc16Cache = uVar28;
              uVar42 = uVar23;
LAB_0018b7a0:
              uVar27 = uVar28 << ((byte)uVar23 & 0x3f);
              local_118 = (uint)uVar39 | (uint)(uVar28 >> (-(byte)uVar23 & 0x3f));
              bVar46 = true;
            }
            else {
              mVar10 = ma_dr_flac__reload_cache(bs);
              if (mVar10 == 0) {
                bVar46 = false;
              }
              else {
                if ((ulong)uVar23 <= 0x40 - (ulong)bs->consumedBits) {
                  uVar28 = bs->cache;
                  uVar42 = bs->consumedBits + uVar23;
                  goto LAB_0018b7a0;
                }
                bVar46 = false;
              }
            }
            bVar6 = true;
            if (!bVar46) goto LAB_0018b7cd;
          }
          else {
            local_118 = (uint)(uVar27 >> (bVar12 & 0x3f));
            uVar27 = uVar27 << (bVar13 & 0x3f);
            uVar42 = uVar42 + iVar7;
          }
          bs->cache = uVar27;
          bs->consumedBits = uVar42;
          bVar6 = false;
        }
        else {
          uVar31 = 0x40 - mVar26;
          do {
            uVar42 = (uint)uVar39;
            uVar23 = bs->nextL2Line;
            if ((ulong)uVar23 < 0x200) {
              mVar26 = bs->crc16CacheIgnoredBytes;
              if (mVar26 == 0) {
                mVar44 = bs->crc16Cache;
                uVar42 = (uint)(mVar44 >> 0x20);
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar42 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(bs->crc16 >> 8) ^
                                                     (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)(ushort)(mVar44 >> 0x30) ^
                                                    ((uint)bs->crc16 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)(ushort)(mVar44 >> 0x30) ^
                                                              ((uint)bs->crc16 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar42 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                           ]) >> 8 & 0xff ^ (uint)(mVar44 >> 0x18) & 0xff] << 8 ^
                              (uint)mVar44 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                 ((uint)bs->crc16 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(bs->crc16 >> 8) ^
                                                                        (uint)(byte)(mVar44 >> 0x38)
                                                                       ]) >> 8 & 0xff) & 0xff] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [(uVar42 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)(ushort)(mVar44 >>
                                                                                        0x30) ^
                                                                         ((uint)bs->crc16 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                      (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                             [((uint)(ushort)(mVar44
                                                                                             >> 0x30
                                                  ) ^ ((uint)bs->crc16 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                             (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff])
                              >> 8 & 0xff ^ (uint)mVar44) & 0xff];
              }
              else {
                uVar17 = bs->crc16;
                uVar42 = (uint)uVar17;
                if (mVar26 - 1 < 7) {
                  mVar44 = bs->crc16Cache;
                  uVar2 = (uint)(mVar44 >> 0x20);
                  switch(mVar26) {
                  case 1:
                    uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]
                                           );
                  case 2:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                  case 3:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                  case 4:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                  case 5:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff])
                    ;
                  case 6:
                    uVar17 = (ushort)(uVar42 << 8) ^
                             ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                  case 7:
                    uVar17 = uVar17 << 8 ^
                             ma_dr_flac__crc16_table
                             [(ulong)((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                  }
                }
                bs->crc16 = uVar17;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar23 + 1;
              uVar27 = bs->cacheL2[uVar23];
              uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
              bs->crc16Cache = uVar27;
              mVar26 = 0;
            }
            else {
              mVar10 = ma_dr_flac__reload_cache(bs);
              if (mVar10 == 0) {
                bVar46 = false;
                goto LAB_0018b513;
              }
              uVar27 = bs->cache;
              mVar26 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar27 == 0) {
                uVar39 = 0x40;
              }
              else {
                if (uVar27 < 0x1000000000000000) {
                  bVar46 = uVar27 >> 0x20 == 0;
                  uVar39 = uVar27 << 0x20;
                  if (!bVar46) {
                    uVar39 = uVar27;
                  }
                  iVar20 = (uint)bVar46 * 0x20;
                  iVar21 = iVar20 + 0x10;
                  uVar28 = uVar39 << 0x10;
                  if (0xffffffffffff < uVar39) {
                    iVar21 = iVar20;
                    uVar28 = uVar39;
                  }
                  iVar20 = iVar21 + 8;
                  uVar39 = uVar28 << 8;
                  if (0xffffffffffffff < uVar28) {
                    iVar20 = iVar21;
                    uVar39 = uVar28;
                  }
                  iVar21 = iVar20 + 4;
                  uVar28 = uVar39 << 4;
                  if (0xfffffffffffffff < uVar39) {
                    iVar21 = iVar20;
                    uVar28 = uVar39;
                  }
                  iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar28 >> 0x3c) * 4);
                }
                else {
                  iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar27 >> 0x3c) * 4);
                }
                uVar39 = (ulong)(iVar21 - 1);
              }
            }
            else {
              uVar39 = LZCOUNT(uVar27);
            }
            uVar42 = (uint)uVar39;
            uVar31 = uVar31 + uVar42;
          } while (0x3f < uVar42);
          bVar46 = true;
          local_104 = uVar31;
LAB_0018b513:
          bVar6 = true;
          uVar31 = local_104;
          if (bVar46) goto LAB_0018b51d;
        }
LAB_0018b7cd:
        if (bVar6) {
          return 0;
        }
        uVar27 = bs->cache;
        mVar26 = bs->consumedBits;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar27 == 0) {
            uVar39 = 0x40;
          }
          else {
            if (uVar27 < 0x1000000000000000) {
              bVar46 = uVar27 >> 0x20 == 0;
              uVar39 = uVar27 << 0x20;
              if (!bVar46) {
                uVar39 = uVar27;
              }
              iVar20 = (uint)bVar46 * 0x20;
              iVar21 = iVar20 + 0x10;
              uVar28 = uVar39 << 0x10;
              if (0xffffffffffff < uVar39) {
                iVar21 = iVar20;
                uVar28 = uVar39;
              }
              iVar20 = iVar21 + 8;
              uVar39 = uVar28 << 8;
              if (0xffffffffffffff < uVar28) {
                iVar20 = iVar21;
                uVar39 = uVar28;
              }
              iVar21 = iVar20 + 4;
              uVar28 = uVar39 << 4;
              if (0xfffffffffffffff < uVar39) {
                iVar21 = iVar20;
                uVar28 = uVar39;
              }
              iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar28 >> 0x3c) * 4);
            }
            else {
              iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar27 >> 0x3c) * 4);
            }
            uVar39 = (ulong)(iVar21 - 1);
          }
        }
        else {
          uVar39 = LZCOUNT(uVar27);
        }
        uVar42 = (uint)uVar39;
        uVar31 = uVar42;
        if (uVar42 < 0x40) {
LAB_0018bbc8:
          local_108 = uVar31;
          uVar27 = uVar27 << ((byte)uVar42 & 0x3f);
          uVar42 = mVar26 + uVar42;
          if (uVar8 < uVar42) {
            uVar39 = uVar27 >> (bVar12 & 0x3f);
            uVar23 = uVar42 - uVar8;
            uVar31 = bs->nextL2Line;
            if ((ulong)uVar31 < 0x200) {
              mVar26 = bs->crc16CacheIgnoredBytes;
              if (mVar26 == 0) {
                mVar44 = bs->crc16Cache;
                uVar42 = (uint)(mVar44 >> 0x20);
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar42 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(bs->crc16 >> 8) ^
                                                     (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)(ushort)(mVar44 >> 0x30) ^
                                                    ((uint)bs->crc16 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)(ushort)(mVar44 >> 0x30) ^
                                                              ((uint)bs->crc16 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar42 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                           ]) >> 8 & 0xff ^ (uint)(mVar44 >> 0x18) & 0xff] << 8 ^
                              (uint)mVar44 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                 ((uint)bs->crc16 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(bs->crc16 >> 8) ^
                                                                        (uint)(byte)(mVar44 >> 0x38)
                                                                       ]) >> 8 & 0xff) & 0xff] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [(uVar42 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)(ushort)(mVar44 >>
                                                                                        0x30) ^
                                                                         ((uint)bs->crc16 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                      (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                             [((uint)(ushort)(mVar44
                                                                                             >> 0x30
                                                  ) ^ ((uint)bs->crc16 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                             (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff])
                              >> 8 & 0xff ^ (uint)mVar44) & 0xff];
              }
              else {
                uVar17 = bs->crc16;
                uVar42 = (uint)uVar17;
                if (mVar26 - 1 < 7) {
                  mVar44 = bs->crc16Cache;
                  uVar2 = (uint)(mVar44 >> 0x20);
                  switch(mVar26) {
                  case 1:
                    uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]
                                           );
                  case 2:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                  case 3:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                  case 4:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                  case 5:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff])
                    ;
                  case 6:
                    uVar17 = (ushort)(uVar42 << 8) ^
                             ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                  case 7:
                    uVar17 = uVar17 << 8 ^
                             ma_dr_flac__crc16_table
                             [((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                  }
                }
                bs->crc16 = uVar17;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar31 + 1;
              uVar27 = bs->cacheL2[uVar31];
              uVar28 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
              bs->crc16Cache = uVar28;
              uVar42 = uVar23;
LAB_0018be4b:
              uVar27 = uVar28 << ((byte)uVar23 & 0x3f);
              local_f0 = (uint)uVar39 | (uint)(uVar28 >> (-(byte)uVar23 & 0x3f));
              bVar46 = true;
            }
            else {
              mVar10 = ma_dr_flac__reload_cache(bs);
              if (mVar10 == 0) {
                bVar46 = false;
              }
              else {
                if ((ulong)uVar23 <= 0x40 - (ulong)bs->consumedBits) {
                  uVar28 = bs->cache;
                  uVar42 = bs->consumedBits + uVar23;
                  goto LAB_0018be4b;
                }
                bVar46 = false;
              }
            }
            bVar6 = true;
            if (!bVar46) goto LAB_0018be78;
          }
          else {
            local_f0 = (uint)(uVar27 >> (bVar12 & 0x3f));
            uVar27 = uVar27 << (bVar13 & 0x3f);
            uVar42 = uVar42 + iVar7;
          }
          bs->cache = uVar27;
          bs->consumedBits = uVar42;
          bVar6 = false;
        }
        else {
          uVar31 = 0x40 - mVar26;
          do {
            uVar42 = (uint)uVar39;
            uVar23 = bs->nextL2Line;
            if ((ulong)uVar23 < 0x200) {
              mVar26 = bs->crc16CacheIgnoredBytes;
              if (mVar26 == 0) {
                mVar44 = bs->crc16Cache;
                uVar42 = (uint)(mVar44 >> 0x20);
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar42 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(bs->crc16 >> 8) ^
                                                     (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)(ushort)(mVar44 >> 0x30) ^
                                                    ((uint)bs->crc16 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)(ushort)(mVar44 >> 0x30) ^
                                                              ((uint)bs->crc16 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar42 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                           ]) >> 8 & 0xff ^ (uint)(mVar44 >> 0x18) & 0xff] << 8 ^
                              (uint)mVar44 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                 ((uint)bs->crc16 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(bs->crc16 >> 8) ^
                                                                        (uint)(byte)(mVar44 >> 0x38)
                                                                       ]) >> 8 & 0xff) & 0xff] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [(uVar42 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)(ushort)(mVar44 >>
                                                                                        0x30) ^
                                                                         ((uint)bs->crc16 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                      (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                             [((uint)(ushort)(mVar44
                                                                                             >> 0x30
                                                  ) ^ ((uint)bs->crc16 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                             (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff])
                              >> 8 & 0xff ^ (uint)mVar44) & 0xff];
              }
              else {
                uVar17 = bs->crc16;
                uVar42 = (uint)uVar17;
                if (mVar26 - 1 < 7) {
                  mVar44 = bs->crc16Cache;
                  uVar2 = (uint)(mVar44 >> 0x20);
                  switch(mVar26) {
                  case 1:
                    uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]
                                           );
                  case 2:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                  case 3:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                  case 4:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                  case 5:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff])
                    ;
                  case 6:
                    uVar17 = (ushort)(uVar42 << 8) ^
                             ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                  case 7:
                    uVar17 = uVar17 << 8 ^
                             ma_dr_flac__crc16_table
                             [(ulong)((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                  }
                }
                bs->crc16 = uVar17;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar23 + 1;
              uVar27 = bs->cacheL2[uVar23];
              uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
              bs->crc16Cache = uVar27;
              mVar26 = 0;
            }
            else {
              mVar10 = ma_dr_flac__reload_cache(bs);
              if (mVar10 == 0) {
                bVar46 = false;
                goto LAB_0018bbbe;
              }
              uVar27 = bs->cache;
              mVar26 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar27 == 0) {
                uVar39 = 0x40;
              }
              else {
                if (uVar27 < 0x1000000000000000) {
                  bVar46 = uVar27 >> 0x20 == 0;
                  uVar39 = uVar27 << 0x20;
                  if (!bVar46) {
                    uVar39 = uVar27;
                  }
                  iVar20 = (uint)bVar46 * 0x20;
                  iVar21 = iVar20 + 0x10;
                  uVar28 = uVar39 << 0x10;
                  if (0xffffffffffff < uVar39) {
                    iVar21 = iVar20;
                    uVar28 = uVar39;
                  }
                  iVar20 = iVar21 + 8;
                  uVar39 = uVar28 << 8;
                  if (0xffffffffffffff < uVar28) {
                    iVar20 = iVar21;
                    uVar39 = uVar28;
                  }
                  iVar21 = iVar20 + 4;
                  uVar28 = uVar39 << 4;
                  if (0xfffffffffffffff < uVar39) {
                    iVar21 = iVar20;
                    uVar28 = uVar39;
                  }
                  iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar28 >> 0x3c) * 4);
                }
                else {
                  iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar27 >> 0x3c) * 4);
                }
                uVar39 = (ulong)(iVar21 - 1);
              }
            }
            else {
              uVar39 = LZCOUNT(uVar27);
            }
            uVar42 = (uint)uVar39;
            uVar31 = uVar31 + uVar42;
          } while (0x3f < uVar42);
          bVar46 = true;
          local_108 = uVar31;
LAB_0018bbbe:
          bVar6 = true;
          uVar31 = local_108;
          if (bVar46) goto LAB_0018bbc8;
        }
LAB_0018be78:
        if (bVar6) {
          return 0;
        }
        uVar27 = bs->cache;
        mVar26 = bs->consumedBits;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar27 == 0) {
            uVar39 = 0x40;
          }
          else {
            if (uVar27 < 0x1000000000000000) {
              bVar46 = uVar27 >> 0x20 == 0;
              uVar39 = uVar27 << 0x20;
              if (!bVar46) {
                uVar39 = uVar27;
              }
              iVar20 = (uint)bVar46 * 0x20;
              iVar21 = iVar20 + 0x10;
              uVar28 = uVar39 << 0x10;
              if (0xffffffffffff < uVar39) {
                iVar21 = iVar20;
                uVar28 = uVar39;
              }
              iVar20 = iVar21 + 8;
              uVar39 = uVar28 << 8;
              if (0xffffffffffffff < uVar28) {
                iVar20 = iVar21;
                uVar39 = uVar28;
              }
              iVar21 = iVar20 + 4;
              uVar28 = uVar39 << 4;
              if (0xfffffffffffffff < uVar39) {
                iVar21 = iVar20;
                uVar28 = uVar39;
              }
              iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar28 >> 0x3c) * 4);
            }
            else {
              iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar27 >> 0x3c) * 4);
            }
            uVar39 = (ulong)(iVar21 - 1);
          }
        }
        else {
          uVar39 = LZCOUNT(uVar27);
        }
        uVar42 = (uint)uVar39;
        uVar31 = uVar42;
        if (uVar42 < 0x40) {
LAB_0018c273:
          local_10c = uVar31;
          uVar27 = uVar27 << ((byte)uVar42 & 0x3f);
          uVar42 = mVar26 + uVar42;
          if (uVar8 < uVar42) {
            uVar39 = uVar27 >> (bVar12 & 0x3f);
            uVar23 = uVar42 - uVar8;
            uVar31 = bs->nextL2Line;
            if ((ulong)uVar31 < 0x200) {
              mVar26 = bs->crc16CacheIgnoredBytes;
              if (mVar26 == 0) {
                mVar44 = bs->crc16Cache;
                uVar42 = (uint)(mVar44 >> 0x20);
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar42 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(bs->crc16 >> 8) ^
                                                     (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)(ushort)(mVar44 >> 0x30) ^
                                                    ((uint)bs->crc16 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)(ushort)(mVar44 >> 0x30) ^
                                                              ((uint)bs->crc16 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar42 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                           ]) >> 8 & 0xff ^ (uint)(mVar44 >> 0x18) & 0xff] << 8 ^
                              (uint)mVar44 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                 ((uint)bs->crc16 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(bs->crc16 >> 8) ^
                                                                        (uint)(byte)(mVar44 >> 0x38)
                                                                       ]) >> 8 & 0xff) & 0xff] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [(uVar42 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)(ushort)(mVar44 >>
                                                                                        0x30) ^
                                                                         ((uint)bs->crc16 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                      (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                             [((uint)(ushort)(mVar44
                                                                                             >> 0x30
                                                  ) ^ ((uint)bs->crc16 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                             (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff])
                              >> 8 & 0xff ^ (uint)mVar44) & 0xff];
              }
              else {
                uVar17 = bs->crc16;
                uVar42 = (uint)uVar17;
                if (mVar26 - 1 < 7) {
                  mVar44 = bs->crc16Cache;
                  uVar2 = (uint)(mVar44 >> 0x20);
                  switch(mVar26) {
                  case 1:
                    uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]
                                           );
                  case 2:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                  case 3:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                  case 4:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                  case 5:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff])
                    ;
                  case 6:
                    uVar17 = (ushort)(uVar42 << 8) ^
                             ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                  case 7:
                    uVar17 = uVar17 << 8 ^
                             ma_dr_flac__crc16_table
                             [((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                  }
                }
                bs->crc16 = uVar17;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar31 + 1;
              uVar27 = bs->cacheL2[uVar31];
              uVar28 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
              bs->crc16Cache = uVar28;
              uVar42 = uVar23;
LAB_0018c501:
              uVar27 = uVar28 << ((byte)uVar23 & 0x3f);
              local_f8 = (uint)uVar39 | (uint)(uVar28 >> (-(byte)uVar23 & 0x3f));
              bVar46 = true;
            }
            else {
              mVar10 = ma_dr_flac__reload_cache(bs);
              if (mVar10 == 0) {
                bVar46 = false;
              }
              else {
                if ((ulong)uVar23 <= 0x40 - (ulong)bs->consumedBits) {
                  uVar28 = bs->cache;
                  uVar42 = bs->consumedBits + uVar23;
                  goto LAB_0018c501;
                }
                bVar46 = false;
              }
            }
            bVar6 = true;
            if (!bVar46) goto LAB_0018c531;
          }
          else {
            local_f8 = (uint)(uVar27 >> (bVar12 & 0x3f));
            uVar27 = uVar27 << (bVar13 & 0x3f);
            uVar42 = uVar42 + iVar7;
          }
          bs->cache = uVar27;
          bs->consumedBits = uVar42;
          bVar6 = false;
        }
        else {
          uVar31 = 0x40 - mVar26;
          do {
            uVar42 = (uint)uVar39;
            uVar23 = bs->nextL2Line;
            if ((ulong)uVar23 < 0x200) {
              mVar26 = bs->crc16CacheIgnoredBytes;
              if (mVar26 == 0) {
                mVar44 = bs->crc16Cache;
                uVar42 = (uint)(mVar44 >> 0x20);
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar42 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(bs->crc16 >> 8) ^
                                                     (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)(ushort)(mVar44 >> 0x30) ^
                                                    ((uint)bs->crc16 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)(ushort)(mVar44 >> 0x30) ^
                                                              ((uint)bs->crc16 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar42 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(bs->crc16 >> 8) ^
                                                                     (uint)(byte)(mVar44 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                           ]) >> 8 & 0xff ^ (uint)(mVar44 >> 0x18) & 0xff] << 8 ^
                              (uint)mVar44 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                 ((uint)bs->crc16 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(bs->crc16 >> 8) ^
                                                                        (uint)(byte)(mVar44 >> 0x38)
                                                                       ]) >> 8 & 0xff) & 0xff] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [(uVar42 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)(ushort)(mVar44 >>
                                                                                        0x30) ^
                                                                         ((uint)bs->crc16 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                        << 8 ^ (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                      (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                             [((uint)(ushort)(mVar44
                                                                                             >> 0x30
                                                  ) ^ ((uint)bs->crc16 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(bs->crc16 >> 8) ^
                                                             (uint)(byte)(mVar44 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                             (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff])
                              >> 8 & 0xff ^ (uint)mVar44) & 0xff];
              }
              else {
                uVar17 = bs->crc16;
                uVar42 = (uint)uVar17;
                if (mVar26 - 1 < 7) {
                  mVar44 = bs->crc16Cache;
                  uVar2 = (uint)(mVar44 >> 0x20);
                  switch(mVar26) {
                  case 1:
                    uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]
                                           );
                  case 2:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                  case 3:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                  case 4:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                  case 5:
                    uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff])
                    ;
                  case 6:
                    uVar17 = (ushort)(uVar42 << 8) ^
                             ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                  case 7:
                    uVar17 = uVar17 << 8 ^
                             ma_dr_flac__crc16_table
                             [(ulong)((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                  }
                }
                bs->crc16 = uVar17;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar23 + 1;
              uVar27 = bs->cacheL2[uVar23];
              uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
              bs->crc16Cache = uVar27;
              mVar26 = 0;
            }
            else {
              mVar10 = ma_dr_flac__reload_cache(bs);
              if (mVar10 == 0) {
                bVar46 = false;
                goto LAB_0018c269;
              }
              uVar27 = bs->cache;
              mVar26 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar27 == 0) {
                uVar39 = 0x40;
              }
              else {
                if (uVar27 < 0x1000000000000000) {
                  bVar46 = uVar27 >> 0x20 == 0;
                  uVar39 = uVar27 << 0x20;
                  if (!bVar46) {
                    uVar39 = uVar27;
                  }
                  iVar20 = (uint)bVar46 * 0x20;
                  iVar21 = iVar20 + 0x10;
                  uVar28 = uVar39 << 0x10;
                  if (0xffffffffffff < uVar39) {
                    iVar21 = iVar20;
                    uVar28 = uVar39;
                  }
                  iVar20 = iVar21 + 8;
                  uVar39 = uVar28 << 8;
                  if (0xffffffffffffff < uVar28) {
                    iVar20 = iVar21;
                    uVar39 = uVar28;
                  }
                  iVar21 = iVar20 + 4;
                  uVar28 = uVar39 << 4;
                  if (0xfffffffffffffff < uVar39) {
                    iVar21 = iVar20;
                    uVar28 = uVar39;
                  }
                  iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar28 >> 0x3c) * 4);
                }
                else {
                  iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar27 >> 0x3c) * 4);
                }
                uVar39 = (ulong)(iVar21 - 1);
              }
            }
            else {
              uVar39 = LZCOUNT(uVar27);
            }
            uVar42 = (uint)uVar39;
            uVar31 = uVar31 + uVar42;
          } while (0x3f < uVar42);
          bVar46 = true;
          local_10c = uVar31;
LAB_0018c269:
          bVar6 = true;
          uVar31 = local_10c;
          if (bVar46) goto LAB_0018c273;
        }
LAB_0018c531:
        if (bVar6) {
          return 0;
        }
        uVar31 = (int)local_100 << (riceParam & 0x1f) | (uint)local_120 & uVar35;
        uVar23 = local_104 << (riceParam & 0x1f) | local_118 & uVar35;
        uVar42 = local_108 << (riceParam & 0x1f) | local_f0 & uVar35;
        local_120._0_4_ = uVar31 >> 1 ^ *(uint *)(&DAT_0019dc58 + (ulong)(uVar31 & 1) * 4);
        uVar31 = local_10c << (riceParam & 0x1f) | local_f8 & uVar35;
        local_118 = uVar23 >> 1 ^ *(uint *)(&DAT_0019dc58 + (ulong)(uVar23 & 1) * 4);
        local_f0 = uVar42 >> 1 ^ *(uint *)(&DAT_0019dc58 + (ulong)(uVar42 & 1) * 4);
        local_f8 = uVar31 >> 1 ^ *(uint *)(&DAT_0019dc58 + (ulong)(uVar31 & 1) * 4);
        iVar18 = lpcOrder - 1;
        iVar9 = 0;
        local_e4 = 0;
        local_e0 = 0;
        local_dc = 0;
        local_d8 = 0;
        local_d4 = 0;
        local_d0 = 0;
        local_cc = 0;
        local_c8 = 0;
        local_c4 = 0;
        local_c0 = 0;
        local_bc = 0;
        local_b8 = 0;
        local_b4 = 0;
        local_b0 = 0;
        local_ac = 0;
        iVar21 = 0;
        iVar34 = 0;
        iVar36 = 0;
        iVar37 = 0;
        iVar24 = 0;
        iVar25 = 0;
        iVar41 = 0;
        iVar43 = 0;
        iVar20 = 0;
        iVar40 = 0;
        iVar29 = 0;
        iVar19 = 0;
        iVar14 = 0;
        iVar38 = 0;
        iVar32 = 0;
        iVar33 = 0;
        switch(iVar18) {
        case 0x1f:
          local_e4 = pSamplesOut[-0x20] * coefficients[0x1f];
        case 0x1e:
          local_e0 = pSamplesOut[-0x1f] * coefficients[0x1e] + local_e4;
        case 0x1d:
          local_dc = pSamplesOut[-0x1e] * coefficients[0x1d] + local_e0;
        case 0x1c:
          local_d8 = pSamplesOut[-0x1d] * coefficients[0x1c] + local_dc;
        case 0x1b:
          local_d4 = pSamplesOut[-0x1c] * coefficients[0x1b] + local_d8;
        case 0x1a:
          local_d0 = pSamplesOut[-0x1b] * coefficients[0x1a] + local_d4;
        case 0x19:
          local_cc = pSamplesOut[-0x1a] * coefficients[0x19] + local_d0;
        case 0x18:
          local_c8 = pSamplesOut[-0x19] * coefficients[0x18] + local_cc;
        case 0x17:
          local_c4 = pSamplesOut[-0x18] * coefficients[0x17] + local_c8;
        case 0x16:
          local_c0 = pSamplesOut[-0x17] * coefficients[0x16] + local_c4;
        case 0x15:
          local_bc = pSamplesOut[-0x16] * coefficients[0x15] + local_c0;
        case 0x14:
          local_b8 = pSamplesOut[-0x15] * coefficients[0x14] + local_bc;
        case 0x13:
          local_b4 = pSamplesOut[-0x14] * coefficients[0x13] + local_b8;
        case 0x12:
          local_b0 = pSamplesOut[-0x13] * coefficients[0x12] + local_b4;
        case 0x11:
          local_ac = pSamplesOut[-0x12] * coefficients[0x11] + local_b0;
        case 0x10:
          iVar21 = pSamplesOut[-0x11] * coefficients[0x10] + local_ac;
        case 0xf:
          iVar34 = pSamplesOut[-0x10] * coefficients[0xf] + iVar21;
        case 0xe:
          iVar36 = pSamplesOut[-0xf] * coefficients[0xe] + iVar34;
        case 0xd:
          iVar37 = pSamplesOut[-0xe] * coefficients[0xd] + iVar36;
        case 0xc:
          iVar24 = pSamplesOut[-0xd] * coefficients[0xc] + iVar37;
        case 0xb:
          iVar25 = pSamplesOut[-0xc] * coefficients[0xb] + iVar24;
        case 10:
          iVar41 = pSamplesOut[-0xb] * coefficients[10] + iVar25;
        case 9:
          iVar43 = pSamplesOut[-10] * coefficients[9] + iVar41;
        case 8:
          iVar20 = pSamplesOut[-9] * coefficients[8] + iVar43;
        case 7:
          iVar40 = pSamplesOut[-8] * coefficients[7] + iVar20;
        case 6:
          iVar29 = pSamplesOut[-7] * coefficients[6] + iVar40;
        case 5:
          iVar19 = pSamplesOut[-6] * coefficients[5] + iVar29;
        case 4:
          iVar14 = pSamplesOut[-5] * coefficients[4] + iVar19;
        case 3:
          iVar38 = pSamplesOut[-4] * coefficients[3] + iVar14;
        case 2:
          iVar32 = pSamplesOut[-3] * coefficients[2] + iVar38;
        case 1:
          iVar33 = pSamplesOut[-2] * coefficients[1] + iVar32;
        case 0:
          iVar9 = pSamplesOut[-1] * *coefficients + iVar33;
        }
        iVar21 = 0;
        *pSamplesOut = (iVar9 >> (bVar11 & 0x1f)) + (uint)local_120;
        switch(iVar18) {
        case 0x1f:
          iVar21 = pSamplesOut[-0x1f] * coefficients[0x1f];
        case 0x1e:
          iVar21 = iVar21 + pSamplesOut[-0x1e] * coefficients[0x1e];
        case 0x1d:
          iVar21 = iVar21 + pSamplesOut[-0x1d] * coefficients[0x1d];
        case 0x1c:
          iVar21 = iVar21 + pSamplesOut[-0x1c] * coefficients[0x1c];
        case 0x1b:
          iVar21 = iVar21 + pSamplesOut[-0x1b] * coefficients[0x1b];
        case 0x1a:
          iVar21 = iVar21 + pSamplesOut[-0x1a] * coefficients[0x1a];
        case 0x19:
          iVar21 = iVar21 + pSamplesOut[-0x19] * coefficients[0x19];
        case 0x18:
          iVar21 = iVar21 + pSamplesOut[-0x18] * coefficients[0x18];
        case 0x17:
          iVar21 = iVar21 + pSamplesOut[-0x17] * coefficients[0x17];
        case 0x16:
          iVar21 = iVar21 + pSamplesOut[-0x16] * coefficients[0x16];
        case 0x15:
          iVar21 = iVar21 + pSamplesOut[-0x15] * coefficients[0x15];
        case 0x14:
          iVar21 = iVar21 + pSamplesOut[-0x14] * coefficients[0x14];
        case 0x13:
          iVar21 = iVar21 + pSamplesOut[-0x13] * coefficients[0x13];
        case 0x12:
          iVar21 = iVar21 + pSamplesOut[-0x12] * coefficients[0x12];
        case 0x11:
          iVar21 = iVar21 + pSamplesOut[-0x11] * coefficients[0x11];
        case 0x10:
          iVar21 = iVar21 + pSamplesOut[-0x10] * coefficients[0x10];
        case 0xf:
          iVar21 = iVar21 + pSamplesOut[-0xf] * coefficients[0xf];
        case 0xe:
          iVar21 = iVar21 + pSamplesOut[-0xe] * coefficients[0xe];
        case 0xd:
          iVar21 = iVar21 + pSamplesOut[-0xd] * coefficients[0xd];
        case 0xc:
          iVar21 = iVar21 + pSamplesOut[-0xc] * coefficients[0xc];
        case 0xb:
          iVar21 = iVar21 + pSamplesOut[-0xb] * coefficients[0xb];
        case 10:
          iVar21 = iVar21 + pSamplesOut[-10] * coefficients[10];
        case 9:
          iVar21 = iVar21 + pSamplesOut[-9] * coefficients[9];
        case 8:
          iVar21 = iVar21 + pSamplesOut[-8] * coefficients[8];
        case 7:
          iVar21 = iVar21 + pSamplesOut[-7] * coefficients[7];
        case 6:
          iVar21 = iVar21 + pSamplesOut[-6] * coefficients[6];
        case 5:
          iVar21 = iVar21 + pSamplesOut[-5] * coefficients[5];
        case 4:
          iVar21 = iVar21 + pSamplesOut[-4] * coefficients[4];
        case 3:
          iVar21 = iVar21 + pSamplesOut[-3] * coefficients[3];
        case 2:
          iVar21 = iVar21 + pSamplesOut[-2] * coefficients[2];
        case 1:
          iVar21 = iVar21 + pSamplesOut[-1] * coefficients[1];
        case 0:
          iVar21 = iVar21 + *pSamplesOut * *coefficients;
        }
        pSamplesOut[1] = (iVar21 >> (bVar11 & 0x1f)) + local_118;
        iVar9 = 0;
        local_e4 = 0;
        local_e0 = 0;
        local_dc = 0;
        local_d8 = 0;
        local_d4 = 0;
        local_d0 = 0;
        local_cc = 0;
        local_c8 = 0;
        local_c4 = 0;
        local_c0 = 0;
        local_bc = 0;
        local_b8 = 0;
        local_b4 = 0;
        local_b0 = 0;
        local_ac = 0;
        iVar21 = 0;
        iVar34 = 0;
        iVar36 = 0;
        iVar37 = 0;
        iVar24 = 0;
        iVar25 = 0;
        iVar41 = 0;
        iVar43 = 0;
        iVar20 = 0;
        iVar40 = 0;
        iVar29 = 0;
        iVar19 = 0;
        iVar14 = 0;
        iVar38 = 0;
        iVar32 = 0;
        iVar33 = 0;
        switch(iVar18) {
        case 0x1f:
          local_e4 = pSamplesOut[-0x1e] * coefficients[0x1f];
        case 0x1e:
          local_e0 = pSamplesOut[-0x1d] * coefficients[0x1e] + local_e4;
        case 0x1d:
          local_dc = pSamplesOut[-0x1c] * coefficients[0x1d] + local_e0;
        case 0x1c:
          local_d8 = pSamplesOut[-0x1b] * coefficients[0x1c] + local_dc;
        case 0x1b:
          local_d4 = pSamplesOut[-0x1a] * coefficients[0x1b] + local_d8;
        case 0x1a:
          local_d0 = pSamplesOut[-0x19] * coefficients[0x1a] + local_d4;
        case 0x19:
          local_cc = pSamplesOut[-0x18] * coefficients[0x19] + local_d0;
        case 0x18:
          local_c8 = pSamplesOut[-0x17] * coefficients[0x18] + local_cc;
        case 0x17:
          local_c4 = pSamplesOut[-0x16] * coefficients[0x17] + local_c8;
        case 0x16:
          local_c0 = pSamplesOut[-0x15] * coefficients[0x16] + local_c4;
        case 0x15:
          local_bc = pSamplesOut[-0x14] * coefficients[0x15] + local_c0;
        case 0x14:
          local_b8 = pSamplesOut[-0x13] * coefficients[0x14] + local_bc;
        case 0x13:
          local_b4 = pSamplesOut[-0x12] * coefficients[0x13] + local_b8;
        case 0x12:
          local_b0 = pSamplesOut[-0x11] * coefficients[0x12] + local_b4;
        case 0x11:
          local_ac = pSamplesOut[-0x10] * coefficients[0x11] + local_b0;
        case 0x10:
          iVar21 = pSamplesOut[-0xf] * coefficients[0x10] + local_ac;
        case 0xf:
          iVar34 = pSamplesOut[-0xe] * coefficients[0xf] + iVar21;
        case 0xe:
          iVar36 = pSamplesOut[-0xd] * coefficients[0xe] + iVar34;
        case 0xd:
          iVar37 = pSamplesOut[-0xc] * coefficients[0xd] + iVar36;
        case 0xc:
          iVar24 = pSamplesOut[-0xb] * coefficients[0xc] + iVar37;
        case 0xb:
          iVar25 = pSamplesOut[-10] * coefficients[0xb] + iVar24;
        case 10:
          iVar41 = pSamplesOut[-9] * coefficients[10] + iVar25;
        case 9:
          iVar43 = pSamplesOut[-8] * coefficients[9] + iVar41;
        case 8:
          iVar20 = pSamplesOut[-7] * coefficients[8] + iVar43;
        case 7:
          iVar40 = pSamplesOut[-6] * coefficients[7] + iVar20;
        case 6:
          iVar29 = pSamplesOut[-5] * coefficients[6] + iVar40;
        case 5:
          iVar19 = pSamplesOut[-4] * coefficients[5] + iVar29;
        case 4:
          iVar14 = pSamplesOut[-3] * coefficients[4] + iVar19;
        case 3:
          iVar38 = pSamplesOut[-2] * coefficients[3] + iVar14;
        case 2:
          iVar32 = pSamplesOut[-1] * coefficients[2] + iVar38;
        case 1:
          iVar33 = *pSamplesOut * coefficients[1] + iVar32;
        case 0:
          iVar9 = pSamplesOut[1] * *coefficients + iVar33;
        }
        iVar21 = 0;
        pSamplesOut[2] = (iVar9 >> (bVar11 & 0x1f)) + local_f0;
        switch(iVar18) {
        case 0x1f:
          iVar21 = pSamplesOut[-0x1d] * coefficients[0x1f];
        case 0x1e:
          iVar21 = iVar21 + pSamplesOut[-0x1c] * coefficients[0x1e];
        case 0x1d:
          iVar21 = iVar21 + pSamplesOut[-0x1b] * coefficients[0x1d];
        case 0x1c:
          iVar21 = iVar21 + pSamplesOut[-0x1a] * coefficients[0x1c];
        case 0x1b:
          iVar21 = iVar21 + pSamplesOut[-0x19] * coefficients[0x1b];
        case 0x1a:
          iVar21 = iVar21 + pSamplesOut[-0x18] * coefficients[0x1a];
        case 0x19:
          iVar21 = iVar21 + pSamplesOut[-0x17] * coefficients[0x19];
        case 0x18:
          iVar21 = iVar21 + pSamplesOut[-0x16] * coefficients[0x18];
        case 0x17:
          iVar21 = iVar21 + pSamplesOut[-0x15] * coefficients[0x17];
        case 0x16:
          iVar21 = iVar21 + pSamplesOut[-0x14] * coefficients[0x16];
        case 0x15:
          iVar21 = iVar21 + pSamplesOut[-0x13] * coefficients[0x15];
        case 0x14:
          iVar21 = iVar21 + pSamplesOut[-0x12] * coefficients[0x14];
        case 0x13:
          iVar21 = iVar21 + pSamplesOut[-0x11] * coefficients[0x13];
        case 0x12:
          iVar21 = iVar21 + pSamplesOut[-0x10] * coefficients[0x12];
        case 0x11:
          iVar21 = iVar21 + pSamplesOut[-0xf] * coefficients[0x11];
        case 0x10:
          iVar21 = iVar21 + pSamplesOut[-0xe] * coefficients[0x10];
        case 0xf:
          iVar21 = iVar21 + pSamplesOut[-0xd] * coefficients[0xf];
        case 0xe:
          iVar21 = iVar21 + pSamplesOut[-0xc] * coefficients[0xe];
        case 0xd:
          iVar21 = iVar21 + pSamplesOut[-0xb] * coefficients[0xd];
        case 0xc:
          iVar21 = iVar21 + pSamplesOut[-10] * coefficients[0xc];
        case 0xb:
          iVar21 = iVar21 + pSamplesOut[-9] * coefficients[0xb];
        case 10:
          iVar21 = iVar21 + pSamplesOut[-8] * coefficients[10];
        case 9:
          iVar21 = iVar21 + pSamplesOut[-7] * coefficients[9];
        case 8:
          iVar21 = iVar21 + pSamplesOut[-6] * coefficients[8];
        case 7:
          iVar21 = iVar21 + pSamplesOut[-5] * coefficients[7];
        case 6:
          iVar21 = iVar21 + pSamplesOut[-4] * coefficients[6];
        case 5:
          iVar21 = iVar21 + pSamplesOut[-3] * coefficients[5];
        case 4:
          iVar21 = iVar21 + pSamplesOut[-2] * coefficients[4];
        case 3:
          iVar21 = iVar21 + pSamplesOut[-1] * coefficients[3];
        case 2:
          iVar21 = iVar21 + *pSamplesOut * coefficients[2];
        case 1:
          iVar21 = iVar21 + pSamplesOut[1] * coefficients[1];
        case 0:
          iVar21 = iVar21 + pSamplesOut[2] * *coefficients;
        }
        pSamplesOut[3] = (iVar21 >> (bVar11 & 0x1f)) + local_f8;
        pSamplesOut = pSamplesOut + 4;
      } while (pSamplesOut < piVar1);
      goto LAB_0018fdcf;
    }
  }
  else if (uVar30 != 0) {
    iVar7 = uVar8 + 1;
    uVar8 = 0x3f - riceParam;
    local_88 = 0;
    local_f0 = 0;
    local_f8 = 0;
    local_120._0_4_ = 0;
    local_10c = 0;
    local_108 = 0;
    local_104 = 0;
    local_100 = 0;
    do {
      uVar27 = bs->cache;
      mVar26 = bs->consumedBits;
      if (ma_dr_flac__gIsLZCNTSupported == 0) {
        if (uVar27 == 0) {
          uVar39 = 0x40;
        }
        else {
          if (uVar27 < 0x1000000000000000) {
            bVar46 = uVar27 >> 0x20 == 0;
            uVar39 = uVar27 << 0x20;
            if (!bVar46) {
              uVar39 = uVar27;
            }
            iVar20 = (uint)bVar46 * 0x20;
            iVar21 = iVar20 + 0x10;
            uVar28 = uVar39 << 0x10;
            if (0xffffffffffff < uVar39) {
              iVar21 = iVar20;
              uVar28 = uVar39;
            }
            iVar20 = iVar21 + 8;
            uVar39 = uVar28 << 8;
            if (0xffffffffffffff < uVar28) {
              iVar20 = iVar21;
              uVar39 = uVar28;
            }
            iVar21 = iVar20 + 4;
            uVar28 = uVar39 << 4;
            if (0xfffffffffffffff < uVar39) {
              iVar21 = iVar20;
              uVar28 = uVar39;
            }
            iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (uVar28 >> 0x3c) * 4);
          }
          else {
            iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                             (uVar27 >> 0x3c) * 4);
          }
          uVar39 = (ulong)(iVar21 - 1);
        }
      }
      else {
        uVar39 = LZCOUNT(uVar27);
      }
      uVar42 = (uint)uVar39;
      bVar13 = (byte)iVar7;
      bVar12 = (byte)uVar8;
      if (uVar42 < 0x40) {
LAB_0018dd73:
        local_100 = uVar39;
        uVar27 = uVar27 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar26 + uVar42;
        if (uVar8 < uVar42) {
          uVar39 = uVar27 >> (bVar12 & 0x3f);
          uVar23 = uVar42 - uVar8;
          uVar31 = bs->nextL2Line;
          if ((ulong)uVar31 < 0x200) {
            mVar26 = bs->crc16CacheIgnoredBytes;
            if (mVar26 == 0) {
              mVar44 = bs->crc16Cache;
              uVar42 = (uint)(mVar44 >> 0x20);
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar42 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)(ushort)(mVar44 >> 0x30) ^
                                                             ((uint)bs->crc16 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                    << 8 ^ (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                  (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)(ushort)(mVar44 >> 0x30) ^
                                                          ((uint)bs->crc16 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)(ushort)(mVar44 >> 0x30
                                                                                     ) ^
                                                                      ((uint)bs->crc16 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(bs->crc16 >> 8)
                                                                             ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)(ushort)(mVar44 >> 0x30)
                                                                     ^ ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                          (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff]) >>
                            8 & 0xff ^ (uint)mVar44) & 0xff];
            }
            else {
              uVar17 = bs->crc16;
              uVar42 = (uint)uVar17;
              if (mVar26 - 1 < 7) {
                mVar44 = bs->crc16Cache;
                uVar2 = (uint)(mVar44 >> 0x20);
                switch(mVar26) {
                case 1:
                  uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]);
                case 2:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                case 3:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                case 4:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                case 5:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]);
                case 6:
                  uVar17 = (ushort)(uVar42 << 8) ^
                           ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                case 7:
                  uVar17 = uVar17 << 8 ^
                           ma_dr_flac__crc16_table
                           [((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                }
              }
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar31 + 1;
            uVar27 = bs->cacheL2[uVar31];
            uVar28 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            bs->crc16Cache = uVar28;
            uVar42 = uVar23;
LAB_0018dff3:
            uVar27 = uVar28 << ((byte)uVar23 & 0x3f);
            local_120._0_4_ = (uint)uVar39 | (uint)(uVar28 >> (-(byte)uVar23 & 0x3f));
            bVar46 = true;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
            }
            else {
              if ((ulong)uVar23 <= 0x40 - (ulong)bs->consumedBits) {
                uVar28 = bs->cache;
                uVar42 = bs->consumedBits + uVar23;
                goto LAB_0018dff3;
              }
              bVar46 = false;
            }
          }
          bVar6 = true;
          if (!bVar46) goto LAB_0018e024;
        }
        else {
          local_120._0_4_ = (uint)(uVar27 >> (bVar12 & 0x3f));
          uVar27 = uVar27 << (bVar13 & 0x3f);
          uVar42 = uVar42 + iVar7;
        }
        bs->cache = uVar27;
        bs->consumedBits = uVar42;
        bVar6 = false;
      }
      else {
        uVar31 = 0x40 - mVar26;
        do {
          uVar42 = (uint)uVar39;
          uVar23 = bs->nextL2Line;
          if ((ulong)uVar23 < 0x200) {
            mVar26 = bs->crc16CacheIgnoredBytes;
            if (mVar26 == 0) {
              mVar44 = bs->crc16Cache;
              uVar42 = (uint)(mVar44 >> 0x20);
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar42 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)(ushort)(mVar44 >> 0x30) ^
                                                             ((uint)bs->crc16 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                    << 8 ^ (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                  (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)(ushort)(mVar44 >> 0x30) ^
                                                          ((uint)bs->crc16 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)(ushort)(mVar44 >> 0x30
                                                                                     ) ^
                                                                      ((uint)bs->crc16 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(bs->crc16 >> 8)
                                                                             ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)(ushort)(mVar44 >> 0x30)
                                                                     ^ ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                          (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff]) >>
                            8 & 0xff ^ (uint)mVar44) & 0xff];
            }
            else {
              uVar17 = bs->crc16;
              uVar42 = (uint)uVar17;
              if (mVar26 - 1 < 7) {
                mVar44 = bs->crc16Cache;
                uVar2 = (uint)(mVar44 >> 0x20);
                switch(mVar26) {
                case 1:
                  uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]);
                case 2:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                case 3:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                case 4:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                case 5:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]);
                case 6:
                  uVar17 = (ushort)(uVar42 << 8) ^
                           ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                case 7:
                  uVar17 = uVar17 << 8 ^
                           ma_dr_flac__crc16_table
                           [(ulong)((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                }
              }
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar23 + 1;
            uVar27 = bs->cacheL2[uVar23];
            uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            bs->crc16Cache = uVar27;
            mVar26 = 0;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
              goto LAB_0018dd64;
            }
            uVar27 = bs->cache;
            mVar26 = bs->consumedBits;
          }
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            if (uVar27 == 0) {
              uVar39 = 0x40;
            }
            else {
              if (uVar27 < 0x1000000000000000) {
                bVar46 = uVar27 >> 0x20 == 0;
                uVar39 = uVar27 << 0x20;
                if (!bVar46) {
                  uVar39 = uVar27;
                }
                iVar20 = (uint)bVar46 * 0x20;
                iVar21 = iVar20 + 0x10;
                uVar28 = uVar39 << 0x10;
                if (0xffffffffffff < uVar39) {
                  iVar21 = iVar20;
                  uVar28 = uVar39;
                }
                iVar20 = iVar21 + 8;
                uVar39 = uVar28 << 8;
                if (0xffffffffffffff < uVar28) {
                  iVar20 = iVar21;
                  uVar39 = uVar28;
                }
                iVar21 = iVar20 + 4;
                uVar28 = uVar39 << 4;
                if (0xfffffffffffffff < uVar39) {
                  iVar21 = iVar20;
                  uVar28 = uVar39;
                }
                iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar28 >> 0x3c) * 4);
              }
              else {
                iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                 (uVar27 >> 0x3c) * 4);
              }
              uVar39 = (ulong)(iVar21 - 1);
            }
          }
          else {
            uVar39 = LZCOUNT(uVar27);
          }
          uVar42 = (uint)uVar39;
          uVar31 = uVar31 + uVar42;
        } while (0x3f < uVar42);
        bVar46 = true;
        local_100 = (ulong)uVar31;
LAB_0018dd64:
        bVar6 = true;
        uVar39 = local_100;
        if (bVar46) goto LAB_0018dd73;
      }
LAB_0018e024:
      if (bVar6) {
        return 0;
      }
      uVar27 = bs->cache;
      mVar26 = bs->consumedBits;
      if (ma_dr_flac__gIsLZCNTSupported == 0) {
        if (uVar27 == 0) {
          uVar39 = 0x40;
        }
        else {
          if (uVar27 < 0x1000000000000000) {
            bVar46 = uVar27 >> 0x20 == 0;
            uVar39 = uVar27 << 0x20;
            if (!bVar46) {
              uVar39 = uVar27;
            }
            iVar20 = (uint)bVar46 * 0x20;
            iVar21 = iVar20 + 0x10;
            uVar28 = uVar39 << 0x10;
            if (0xffffffffffff < uVar39) {
              iVar21 = iVar20;
              uVar28 = uVar39;
            }
            iVar20 = iVar21 + 8;
            uVar39 = uVar28 << 8;
            if (0xffffffffffffff < uVar28) {
              iVar20 = iVar21;
              uVar39 = uVar28;
            }
            iVar21 = iVar20 + 4;
            uVar28 = uVar39 << 4;
            if (0xfffffffffffffff < uVar39) {
              iVar21 = iVar20;
              uVar28 = uVar39;
            }
            iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (uVar28 >> 0x3c) * 4);
          }
          else {
            iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                             (uVar27 >> 0x3c) * 4);
          }
          uVar39 = (ulong)(iVar21 - 1);
        }
      }
      else {
        uVar39 = LZCOUNT(uVar27);
      }
      uVar42 = (uint)uVar39;
      uVar31 = uVar42;
      if (uVar42 < 0x40) {
LAB_0018e430:
        local_104 = uVar31;
        uVar27 = uVar27 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar26 + uVar42;
        if (uVar8 < uVar42) {
          uVar39 = uVar27 >> (bVar12 & 0x3f);
          uVar23 = uVar42 - uVar8;
          uVar31 = bs->nextL2Line;
          if ((ulong)uVar31 < 0x200) {
            mVar26 = bs->crc16CacheIgnoredBytes;
            if (mVar26 == 0) {
              mVar44 = bs->crc16Cache;
              uVar42 = (uint)(mVar44 >> 0x20);
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar42 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)(ushort)(mVar44 >> 0x30) ^
                                                             ((uint)bs->crc16 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                    << 8 ^ (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                  (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)(ushort)(mVar44 >> 0x30) ^
                                                          ((uint)bs->crc16 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)(ushort)(mVar44 >> 0x30
                                                                                     ) ^
                                                                      ((uint)bs->crc16 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(bs->crc16 >> 8)
                                                                             ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)(ushort)(mVar44 >> 0x30)
                                                                     ^ ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                          (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff]) >>
                            8 & 0xff ^ (uint)mVar44) & 0xff];
            }
            else {
              uVar17 = bs->crc16;
              uVar42 = (uint)uVar17;
              if (mVar26 - 1 < 7) {
                mVar44 = bs->crc16Cache;
                uVar2 = (uint)(mVar44 >> 0x20);
                switch(mVar26) {
                case 1:
                  uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]);
                case 2:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                case 3:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                case 4:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                case 5:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]);
                case 6:
                  uVar17 = (ushort)(uVar42 << 8) ^
                           ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                case 7:
                  uVar17 = uVar17 << 8 ^
                           ma_dr_flac__crc16_table
                           [((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                }
              }
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar31 + 1;
            uVar27 = bs->cacheL2[uVar31];
            uVar28 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            bs->crc16Cache = uVar28;
            uVar42 = uVar23;
LAB_0018e6b2:
            uVar27 = uVar28 << ((byte)uVar23 & 0x3f);
            local_f8 = (uint)uVar39 | (uint)(uVar28 >> (-(byte)uVar23 & 0x3f));
            bVar46 = true;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
            }
            else {
              if ((ulong)uVar23 <= 0x40 - (ulong)bs->consumedBits) {
                uVar28 = bs->cache;
                uVar42 = bs->consumedBits + uVar23;
                goto LAB_0018e6b2;
              }
              bVar46 = false;
            }
          }
          bVar6 = true;
          if (!bVar46) goto LAB_0018e6e4;
        }
        else {
          local_f8 = (uint)(uVar27 >> (bVar12 & 0x3f));
          uVar27 = uVar27 << (bVar13 & 0x3f);
          uVar42 = uVar42 + iVar7;
        }
        bs->cache = uVar27;
        bs->consumedBits = uVar42;
        bVar6 = false;
      }
      else {
        uVar31 = 0x40 - mVar26;
        do {
          uVar42 = (uint)uVar39;
          uVar23 = bs->nextL2Line;
          if ((ulong)uVar23 < 0x200) {
            mVar26 = bs->crc16CacheIgnoredBytes;
            if (mVar26 == 0) {
              mVar44 = bs->crc16Cache;
              uVar42 = (uint)(mVar44 >> 0x20);
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar42 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)(ushort)(mVar44 >> 0x30) ^
                                                             ((uint)bs->crc16 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                    << 8 ^ (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                  (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)(ushort)(mVar44 >> 0x30) ^
                                                          ((uint)bs->crc16 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)(ushort)(mVar44 >> 0x30
                                                                                     ) ^
                                                                      ((uint)bs->crc16 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(bs->crc16 >> 8)
                                                                             ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)(ushort)(mVar44 >> 0x30)
                                                                     ^ ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                          (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff]) >>
                            8 & 0xff ^ (uint)mVar44) & 0xff];
            }
            else {
              uVar17 = bs->crc16;
              uVar42 = (uint)uVar17;
              if (mVar26 - 1 < 7) {
                mVar44 = bs->crc16Cache;
                uVar2 = (uint)(mVar44 >> 0x20);
                switch(mVar26) {
                case 1:
                  uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]);
                case 2:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                case 3:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                case 4:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                case 5:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]);
                case 6:
                  uVar17 = (ushort)(uVar42 << 8) ^
                           ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                case 7:
                  uVar17 = uVar17 << 8 ^
                           ma_dr_flac__crc16_table
                           [(ulong)((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                }
              }
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar23 + 1;
            uVar27 = bs->cacheL2[uVar23];
            uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            bs->crc16Cache = uVar27;
            mVar26 = 0;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
              goto LAB_0018e421;
            }
            uVar27 = bs->cache;
            mVar26 = bs->consumedBits;
          }
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            if (uVar27 == 0) {
              uVar39 = 0x40;
            }
            else {
              if (uVar27 < 0x1000000000000000) {
                bVar46 = uVar27 >> 0x20 == 0;
                uVar39 = uVar27 << 0x20;
                if (!bVar46) {
                  uVar39 = uVar27;
                }
                iVar20 = (uint)bVar46 * 0x20;
                iVar21 = iVar20 + 0x10;
                uVar28 = uVar39 << 0x10;
                if (0xffffffffffff < uVar39) {
                  iVar21 = iVar20;
                  uVar28 = uVar39;
                }
                iVar20 = iVar21 + 8;
                uVar39 = uVar28 << 8;
                if (0xffffffffffffff < uVar28) {
                  iVar20 = iVar21;
                  uVar39 = uVar28;
                }
                iVar21 = iVar20 + 4;
                uVar28 = uVar39 << 4;
                if (0xfffffffffffffff < uVar39) {
                  iVar21 = iVar20;
                  uVar28 = uVar39;
                }
                iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar28 >> 0x3c) * 4);
              }
              else {
                iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                 (uVar27 >> 0x3c) * 4);
              }
              uVar39 = (ulong)(iVar21 - 1);
            }
          }
          else {
            uVar39 = LZCOUNT(uVar27);
          }
          uVar42 = (uint)uVar39;
          uVar31 = uVar31 + uVar42;
        } while (0x3f < uVar42);
        bVar46 = true;
        local_104 = uVar31;
LAB_0018e421:
        bVar6 = true;
        uVar31 = local_104;
        if (bVar46) goto LAB_0018e430;
      }
LAB_0018e6e4:
      if (bVar6) {
        return 0;
      }
      uVar27 = bs->cache;
      mVar26 = bs->consumedBits;
      if (ma_dr_flac__gIsLZCNTSupported == 0) {
        if (uVar27 == 0) {
          uVar39 = 0x40;
        }
        else {
          if (uVar27 < 0x1000000000000000) {
            bVar46 = uVar27 >> 0x20 == 0;
            uVar39 = uVar27 << 0x20;
            if (!bVar46) {
              uVar39 = uVar27;
            }
            iVar20 = (uint)bVar46 * 0x20;
            iVar21 = iVar20 + 0x10;
            uVar28 = uVar39 << 0x10;
            if (0xffffffffffff < uVar39) {
              iVar21 = iVar20;
              uVar28 = uVar39;
            }
            iVar20 = iVar21 + 8;
            uVar39 = uVar28 << 8;
            if (0xffffffffffffff < uVar28) {
              iVar20 = iVar21;
              uVar39 = uVar28;
            }
            iVar21 = iVar20 + 4;
            uVar28 = uVar39 << 4;
            if (0xfffffffffffffff < uVar39) {
              iVar21 = iVar20;
              uVar28 = uVar39;
            }
            iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (uVar28 >> 0x3c) * 4);
          }
          else {
            iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                             (uVar27 >> 0x3c) * 4);
          }
          uVar39 = (ulong)(iVar21 - 1);
        }
      }
      else {
        uVar39 = LZCOUNT(uVar27);
      }
      uVar42 = (uint)uVar39;
      uVar31 = uVar42;
      if (uVar42 < 0x40) {
LAB_0018eae5:
        local_108 = uVar31;
        uVar27 = uVar27 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar26 + uVar42;
        if (uVar8 < uVar42) {
          uVar39 = uVar27 >> (bVar12 & 0x3f);
          uVar23 = uVar42 - uVar8;
          uVar31 = bs->nextL2Line;
          if ((ulong)uVar31 < 0x200) {
            mVar26 = bs->crc16CacheIgnoredBytes;
            if (mVar26 == 0) {
              mVar44 = bs->crc16Cache;
              uVar42 = (uint)(mVar44 >> 0x20);
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar42 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)(ushort)(mVar44 >> 0x30) ^
                                                             ((uint)bs->crc16 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                    << 8 ^ (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                  (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)(ushort)(mVar44 >> 0x30) ^
                                                          ((uint)bs->crc16 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)(ushort)(mVar44 >> 0x30
                                                                                     ) ^
                                                                      ((uint)bs->crc16 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(bs->crc16 >> 8)
                                                                             ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)(ushort)(mVar44 >> 0x30)
                                                                     ^ ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                          (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff]) >>
                            8 & 0xff ^ (uint)mVar44) & 0xff];
            }
            else {
              uVar17 = bs->crc16;
              uVar42 = (uint)uVar17;
              if (mVar26 - 1 < 7) {
                mVar44 = bs->crc16Cache;
                uVar2 = (uint)(mVar44 >> 0x20);
                switch(mVar26) {
                case 1:
                  uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]);
                case 2:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                case 3:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                case 4:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                case 5:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]);
                case 6:
                  uVar17 = (ushort)(uVar42 << 8) ^
                           ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                case 7:
                  uVar17 = uVar17 << 8 ^
                           ma_dr_flac__crc16_table
                           [((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                }
              }
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar31 + 1;
            uVar27 = bs->cacheL2[uVar31];
            uVar28 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            bs->crc16Cache = uVar28;
            uVar42 = uVar23;
LAB_0018ed67:
            uVar27 = uVar28 << ((byte)uVar23 & 0x3f);
            local_f0 = (uint)uVar39 | (uint)(uVar28 >> (-(byte)uVar23 & 0x3f));
            bVar46 = true;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
            }
            else {
              if ((ulong)uVar23 <= 0x40 - (ulong)bs->consumedBits) {
                uVar28 = bs->cache;
                uVar42 = bs->consumedBits + uVar23;
                goto LAB_0018ed67;
              }
              bVar46 = false;
            }
          }
          bVar6 = true;
          if (!bVar46) goto LAB_0018ed99;
        }
        else {
          local_f0 = (uint)(uVar27 >> (bVar12 & 0x3f));
          uVar27 = uVar27 << (bVar13 & 0x3f);
          uVar42 = uVar42 + iVar7;
        }
        bs->cache = uVar27;
        bs->consumedBits = uVar42;
        bVar6 = false;
      }
      else {
        uVar31 = 0x40 - mVar26;
        do {
          uVar42 = (uint)uVar39;
          uVar23 = bs->nextL2Line;
          if ((ulong)uVar23 < 0x200) {
            mVar26 = bs->crc16CacheIgnoredBytes;
            if (mVar26 == 0) {
              mVar44 = bs->crc16Cache;
              uVar42 = (uint)(mVar44 >> 0x20);
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar42 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)(ushort)(mVar44 >> 0x30) ^
                                                             ((uint)bs->crc16 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                    << 8 ^ (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                  (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)(ushort)(mVar44 >> 0x30) ^
                                                          ((uint)bs->crc16 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)(ushort)(mVar44 >> 0x30
                                                                                     ) ^
                                                                      ((uint)bs->crc16 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(bs->crc16 >> 8)
                                                                             ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)(ushort)(mVar44 >> 0x30)
                                                                     ^ ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                          (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff]) >>
                            8 & 0xff ^ (uint)mVar44) & 0xff];
            }
            else {
              uVar17 = bs->crc16;
              uVar42 = (uint)uVar17;
              if (mVar26 - 1 < 7) {
                mVar44 = bs->crc16Cache;
                uVar2 = (uint)(mVar44 >> 0x20);
                switch(mVar26) {
                case 1:
                  uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]);
                case 2:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                case 3:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                case 4:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                case 5:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]);
                case 6:
                  uVar17 = (ushort)(uVar42 << 8) ^
                           ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                case 7:
                  uVar17 = uVar17 << 8 ^
                           ma_dr_flac__crc16_table
                           [(ulong)((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                }
              }
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar23 + 1;
            uVar27 = bs->cacheL2[uVar23];
            uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            bs->crc16Cache = uVar27;
            mVar26 = 0;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
              goto LAB_0018ead6;
            }
            uVar27 = bs->cache;
            mVar26 = bs->consumedBits;
          }
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            if (uVar27 == 0) {
              uVar39 = 0x40;
            }
            else {
              if (uVar27 < 0x1000000000000000) {
                bVar46 = uVar27 >> 0x20 == 0;
                uVar39 = uVar27 << 0x20;
                if (!bVar46) {
                  uVar39 = uVar27;
                }
                iVar20 = (uint)bVar46 * 0x20;
                iVar21 = iVar20 + 0x10;
                uVar28 = uVar39 << 0x10;
                if (0xffffffffffff < uVar39) {
                  iVar21 = iVar20;
                  uVar28 = uVar39;
                }
                iVar20 = iVar21 + 8;
                uVar39 = uVar28 << 8;
                if (0xffffffffffffff < uVar28) {
                  iVar20 = iVar21;
                  uVar39 = uVar28;
                }
                iVar21 = iVar20 + 4;
                uVar28 = uVar39 << 4;
                if (0xfffffffffffffff < uVar39) {
                  iVar21 = iVar20;
                  uVar28 = uVar39;
                }
                iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar28 >> 0x3c) * 4);
              }
              else {
                iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                 (uVar27 >> 0x3c) * 4);
              }
              uVar39 = (ulong)(iVar21 - 1);
            }
          }
          else {
            uVar39 = LZCOUNT(uVar27);
          }
          uVar42 = (uint)uVar39;
          uVar31 = uVar31 + uVar42;
        } while (0x3f < uVar42);
        bVar46 = true;
        local_108 = uVar31;
LAB_0018ead6:
        bVar6 = true;
        uVar31 = local_108;
        if (bVar46) goto LAB_0018eae5;
      }
LAB_0018ed99:
      if (bVar6) {
        return 0;
      }
      uVar27 = bs->cache;
      mVar26 = bs->consumedBits;
      if (ma_dr_flac__gIsLZCNTSupported == 0) {
        if (uVar27 == 0) {
          uVar39 = 0x40;
        }
        else {
          if (uVar27 < 0x1000000000000000) {
            bVar46 = uVar27 >> 0x20 == 0;
            uVar39 = uVar27 << 0x20;
            if (!bVar46) {
              uVar39 = uVar27;
            }
            iVar20 = (uint)bVar46 * 0x20;
            iVar21 = iVar20 + 0x10;
            uVar28 = uVar39 << 0x10;
            if (0xffffffffffff < uVar39) {
              iVar21 = iVar20;
              uVar28 = uVar39;
            }
            iVar20 = iVar21 + 8;
            uVar39 = uVar28 << 8;
            if (0xffffffffffffff < uVar28) {
              iVar20 = iVar21;
              uVar39 = uVar28;
            }
            iVar21 = iVar20 + 4;
            uVar28 = uVar39 << 4;
            if (0xfffffffffffffff < uVar39) {
              iVar21 = iVar20;
              uVar28 = uVar39;
            }
            iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (uVar28 >> 0x3c) * 4);
          }
          else {
            iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                             (uVar27 >> 0x3c) * 4);
          }
          uVar39 = (ulong)(iVar21 - 1);
        }
      }
      else {
        uVar39 = LZCOUNT(uVar27);
      }
      uVar42 = (uint)uVar39;
      uVar31 = uVar42;
      if (uVar42 < 0x40) {
LAB_0018f19a:
        local_10c = uVar31;
        uVar27 = uVar27 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar26 + uVar42;
        if (uVar8 < uVar42) {
          uVar39 = uVar27 >> (bVar12 & 0x3f);
          uVar23 = uVar42 - uVar8;
          uVar31 = bs->nextL2Line;
          if ((ulong)uVar31 < 0x200) {
            mVar26 = bs->crc16CacheIgnoredBytes;
            if (mVar26 == 0) {
              mVar44 = bs->crc16Cache;
              uVar42 = (uint)(mVar44 >> 0x20);
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar42 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)(ushort)(mVar44 >> 0x30) ^
                                                             ((uint)bs->crc16 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                    << 8 ^ (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                  (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)(ushort)(mVar44 >> 0x30) ^
                                                          ((uint)bs->crc16 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)(ushort)(mVar44 >> 0x30
                                                                                     ) ^
                                                                      ((uint)bs->crc16 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(bs->crc16 >> 8)
                                                                             ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)(ushort)(mVar44 >> 0x30)
                                                                     ^ ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                          (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff]) >>
                            8 & 0xff ^ (uint)mVar44) & 0xff];
            }
            else {
              uVar17 = bs->crc16;
              uVar42 = (uint)uVar17;
              if (mVar26 - 1 < 7) {
                mVar44 = bs->crc16Cache;
                uVar2 = (uint)(mVar44 >> 0x20);
                switch(mVar26) {
                case 1:
                  uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]);
                case 2:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                case 3:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                case 4:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                case 5:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]);
                case 6:
                  uVar17 = (ushort)(uVar42 << 8) ^
                           ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                case 7:
                  uVar17 = uVar17 << 8 ^
                           ma_dr_flac__crc16_table
                           [((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                }
              }
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar31 + 1;
            uVar27 = bs->cacheL2[uVar31];
            uVar28 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            bs->crc16Cache = uVar28;
            uVar42 = uVar23;
LAB_0018f42c:
            uVar27 = uVar28 << ((byte)uVar23 & 0x3f);
            local_88 = (uint)uVar39 | (uint)(uVar28 >> (-(byte)uVar23 & 0x3f));
            bVar46 = true;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
            }
            else {
              if ((ulong)uVar23 <= 0x40 - (ulong)bs->consumedBits) {
                uVar28 = bs->cache;
                uVar42 = bs->consumedBits + uVar23;
                goto LAB_0018f42c;
              }
              bVar46 = false;
            }
          }
          bVar6 = true;
          if (!bVar46) goto LAB_0018f460;
        }
        else {
          local_88 = (uint)(uVar27 >> (bVar12 & 0x3f));
          uVar27 = uVar27 << (bVar13 & 0x3f);
          uVar42 = uVar42 + iVar7;
        }
        bs->cache = uVar27;
        bs->consumedBits = uVar42;
        bVar6 = false;
      }
      else {
        uVar31 = 0x40 - mVar26;
        do {
          uVar42 = (uint)uVar39;
          uVar23 = bs->nextL2Line;
          if ((ulong)uVar23 < 0x200) {
            mVar26 = bs->crc16CacheIgnoredBytes;
            if (mVar26 == 0) {
              mVar44 = bs->crc16Cache;
              uVar42 = (uint)(mVar44 >> 0x20);
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar42 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)(ushort)(mVar44 >> 0x30) ^
                                                             ((uint)bs->crc16 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                    << 8 ^ (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                  (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)(ushort)(mVar44 >> 0x30) ^
                                                          ((uint)bs->crc16 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)(ushort)(mVar44 >> 0x30
                                                                                     ) ^
                                                                      ((uint)bs->crc16 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(bs->crc16 >> 8)
                                                                             ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)(ushort)(mVar44 >> 0x30)
                                                                     ^ ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                          (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff]) >>
                            8 & 0xff ^ (uint)mVar44) & 0xff];
            }
            else {
              uVar17 = bs->crc16;
              uVar42 = (uint)uVar17;
              if (mVar26 - 1 < 7) {
                mVar44 = bs->crc16Cache;
                uVar2 = (uint)(mVar44 >> 0x20);
                switch(mVar26) {
                case 1:
                  uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]);
                case 2:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42) >> 8 & 0xff]);
                case 3:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar2 ^ uVar42 >> 8) & 0xff]);
                case 4:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                case 5:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]);
                case 6:
                  uVar17 = (ushort)(uVar42 << 8) ^
                           ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                case 7:
                  uVar17 = uVar17 << 8 ^
                           ma_dr_flac__crc16_table
                           [(ulong)((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                }
              }
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar23 + 1;
            uVar27 = bs->cacheL2[uVar23];
            uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            bs->crc16Cache = uVar27;
            mVar26 = 0;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
              goto LAB_0018f18b;
            }
            uVar27 = bs->cache;
            mVar26 = bs->consumedBits;
          }
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            if (uVar27 == 0) {
              uVar39 = 0x40;
            }
            else {
              if (uVar27 < 0x1000000000000000) {
                bVar46 = uVar27 >> 0x20 == 0;
                uVar39 = uVar27 << 0x20;
                if (!bVar46) {
                  uVar39 = uVar27;
                }
                iVar20 = (uint)bVar46 * 0x20;
                iVar21 = iVar20 + 0x10;
                uVar28 = uVar39 << 0x10;
                if (0xffffffffffff < uVar39) {
                  iVar21 = iVar20;
                  uVar28 = uVar39;
                }
                iVar20 = iVar21 + 8;
                uVar39 = uVar28 << 8;
                if (0xffffffffffffff < uVar28) {
                  iVar20 = iVar21;
                  uVar39 = uVar28;
                }
                iVar21 = iVar20 + 4;
                uVar28 = uVar39 << 4;
                if (0xfffffffffffffff < uVar39) {
                  iVar21 = iVar20;
                  uVar28 = uVar39;
                }
                iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar28 >> 0x3c) * 4);
              }
              else {
                iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                 (uVar27 >> 0x3c) * 4);
              }
              uVar39 = (ulong)(iVar21 - 1);
            }
          }
          else {
            uVar39 = LZCOUNT(uVar27);
          }
          uVar42 = (uint)uVar39;
          uVar31 = uVar31 + uVar42;
        } while (0x3f < uVar42);
        bVar46 = true;
        local_10c = uVar31;
LAB_0018f18b:
        bVar6 = true;
        uVar31 = local_10c;
        if (bVar46) goto LAB_0018f19a;
      }
LAB_0018f460:
      if (bVar6) {
        return 0;
      }
      uVar31 = (int)local_100 << (riceParam & 0x1f) | (uint)local_120 & uVar35;
      uVar23 = local_104 << (riceParam & 0x1f) | local_f8 & uVar35;
      uVar42 = local_108 << (riceParam & 0x1f) | local_f0 & uVar35;
      local_120._0_4_ = uVar31 >> 1 ^ *(uint *)(&DAT_0019dc58 + (ulong)(uVar31 & 1) * 4);
      uVar31 = local_10c << (riceParam & 0x1f) | local_88 & uVar35;
      local_f8 = uVar23 >> 1 ^ *(uint *)(&DAT_0019dc58 + (ulong)(uVar23 & 1) * 4);
      local_f0 = uVar42 >> 1 ^ *(uint *)(&DAT_0019dc58 + (ulong)(uVar42 & 1) * 4);
      local_88 = uVar31 >> 1 ^ *(uint *)(&DAT_0019dc58 + (ulong)(uVar31 & 1) * 4);
      lVar22 = 0;
      iVar21 = lpcOrder - 1;
      switch(iVar21) {
      case 0x1f:
        lVar22 = (long)pSamplesOut[-0x20] * (long)coefficients[0x1f];
      case 0x1e:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1f] * (long)coefficients[0x1e];
      case 0x1d:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1e] * (long)coefficients[0x1d];
      case 0x1c:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1c];
      case 0x1b:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1b];
      case 0x1a:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1a];
      case 0x19:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x19];
      case 0x18:
        lVar22 = lVar22 + (long)pSamplesOut[-0x19] * (long)coefficients[0x18];
      case 0x17:
        lVar22 = lVar22 + (long)pSamplesOut[-0x18] * (long)coefficients[0x17];
      case 0x16:
        lVar22 = lVar22 + (long)pSamplesOut[-0x17] * (long)coefficients[0x16];
      case 0x15:
        lVar22 = lVar22 + (long)pSamplesOut[-0x16] * (long)coefficients[0x15];
      case 0x14:
        lVar22 = lVar22 + (long)pSamplesOut[-0x15] * (long)coefficients[0x14];
      case 0x13:
        lVar22 = lVar22 + (long)pSamplesOut[-0x14] * (long)coefficients[0x13];
      case 0x12:
        lVar22 = lVar22 + (long)pSamplesOut[-0x13] * (long)coefficients[0x12];
      case 0x11:
        lVar22 = lVar22 + (long)pSamplesOut[-0x12] * (long)coefficients[0x11];
      case 0x10:
        lVar22 = lVar22 + (long)pSamplesOut[-0x11] * (long)coefficients[0x10];
      case 0xf:
        lVar22 = lVar22 + (long)pSamplesOut[-0x10] * (long)coefficients[0xf];
      case 0xe:
        lVar22 = lVar22 + (long)pSamplesOut[-0xf] * (long)coefficients[0xe];
      case 0xd:
        lVar22 = lVar22 + (long)pSamplesOut[-0xe] * (long)coefficients[0xd];
      case 0xc:
        lVar22 = lVar22 + (long)pSamplesOut[-0xd] * (long)coefficients[0xc];
      case 0xb:
        lVar22 = lVar22 + (long)pSamplesOut[-0xc] * (long)coefficients[0xb];
      case 10:
        lVar22 = lVar22 + (long)pSamplesOut[-0xb] * (long)coefficients[10];
      case 9:
        lVar22 = lVar22 + (long)pSamplesOut[-10] * (long)coefficients[9];
      case 8:
        lVar22 = lVar22 + (long)pSamplesOut[-9] * (long)coefficients[8];
      case 7:
        lVar22 = lVar22 + (long)pSamplesOut[-8] * (long)coefficients[7];
      case 6:
        lVar22 = lVar22 + (long)pSamplesOut[-7] * (long)coefficients[6];
      case 5:
        lVar22 = lVar22 + (long)pSamplesOut[-6] * (long)coefficients[5];
      case 4:
        lVar22 = lVar22 + (long)pSamplesOut[-5] * (long)coefficients[4];
      case 3:
        lVar22 = lVar22 + (long)pSamplesOut[-4] * (long)coefficients[3];
      case 2:
        lVar22 = lVar22 + (long)pSamplesOut[-3] * (long)coefficients[2];
      case 1:
        lVar22 = lVar22 + (long)pSamplesOut[-2] * (long)coefficients[1];
      case 0:
        lVar22 = lVar22 + (long)pSamplesOut[-1] * (long)*coefficients;
      }
      *pSamplesOut = (int)(lVar22 >> (bVar11 & 0x3f)) + (uint)local_120;
      lVar22 = 0;
      switch(iVar21) {
      case 0x1f:
        lVar22 = (long)pSamplesOut[-0x1f] * (long)coefficients[0x1f];
      case 0x1e:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1e] * (long)coefficients[0x1e];
      case 0x1d:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1d];
      case 0x1c:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1c];
      case 0x1b:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1b];
      case 0x1a:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x1a];
      case 0x19:
        lVar22 = lVar22 + (long)pSamplesOut[-0x19] * (long)coefficients[0x19];
      case 0x18:
        lVar22 = lVar22 + (long)pSamplesOut[-0x18] * (long)coefficients[0x18];
      case 0x17:
        lVar22 = lVar22 + (long)pSamplesOut[-0x17] * (long)coefficients[0x17];
      case 0x16:
        lVar22 = lVar22 + (long)pSamplesOut[-0x16] * (long)coefficients[0x16];
      case 0x15:
        lVar22 = lVar22 + (long)pSamplesOut[-0x15] * (long)coefficients[0x15];
      case 0x14:
        lVar22 = lVar22 + (long)pSamplesOut[-0x14] * (long)coefficients[0x14];
      case 0x13:
        lVar22 = lVar22 + (long)pSamplesOut[-0x13] * (long)coefficients[0x13];
      case 0x12:
        lVar22 = lVar22 + (long)pSamplesOut[-0x12] * (long)coefficients[0x12];
      case 0x11:
        lVar22 = lVar22 + (long)pSamplesOut[-0x11] * (long)coefficients[0x11];
      case 0x10:
        lVar22 = lVar22 + (long)pSamplesOut[-0x10] * (long)coefficients[0x10];
      case 0xf:
        lVar22 = lVar22 + (long)pSamplesOut[-0xf] * (long)coefficients[0xf];
      case 0xe:
        lVar22 = lVar22 + (long)pSamplesOut[-0xe] * (long)coefficients[0xe];
      case 0xd:
        lVar22 = lVar22 + (long)pSamplesOut[-0xd] * (long)coefficients[0xd];
      case 0xc:
        lVar22 = lVar22 + (long)pSamplesOut[-0xc] * (long)coefficients[0xc];
      case 0xb:
        lVar22 = lVar22 + (long)pSamplesOut[-0xb] * (long)coefficients[0xb];
      case 10:
        lVar22 = lVar22 + (long)pSamplesOut[-10] * (long)coefficients[10];
      case 9:
        lVar22 = lVar22 + (long)pSamplesOut[-9] * (long)coefficients[9];
      case 8:
        lVar22 = lVar22 + (long)pSamplesOut[-8] * (long)coefficients[8];
      case 7:
        lVar22 = lVar22 + (long)pSamplesOut[-7] * (long)coefficients[7];
      case 6:
        lVar22 = lVar22 + (long)pSamplesOut[-6] * (long)coefficients[6];
      case 5:
        lVar22 = lVar22 + (long)pSamplesOut[-5] * (long)coefficients[5];
      case 4:
        lVar22 = lVar22 + (long)pSamplesOut[-4] * (long)coefficients[4];
      case 3:
        lVar22 = lVar22 + (long)pSamplesOut[-3] * (long)coefficients[3];
      case 2:
        lVar22 = lVar22 + (long)pSamplesOut[-2] * (long)coefficients[2];
      case 1:
        lVar22 = lVar22 + (long)pSamplesOut[-1] * (long)coefficients[1];
      case 0:
        lVar22 = lVar22 + (long)*pSamplesOut * (long)*coefficients;
      }
      pSamplesOut[1] = (int)(lVar22 >> (bVar11 & 0x3f)) + local_f8;
      lVar22 = 0;
      switch(iVar21) {
      case 0x1f:
        lVar22 = (long)pSamplesOut[-0x1e] * (long)coefficients[0x1f];
      case 0x1e:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1e];
      case 0x1d:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1d];
      case 0x1c:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1c];
      case 0x1b:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x1b];
      case 0x1a:
        lVar22 = lVar22 + (long)pSamplesOut[-0x19] * (long)coefficients[0x1a];
      case 0x19:
        lVar22 = lVar22 + (long)pSamplesOut[-0x18] * (long)coefficients[0x19];
      case 0x18:
        lVar22 = lVar22 + (long)pSamplesOut[-0x17] * (long)coefficients[0x18];
      case 0x17:
        lVar22 = lVar22 + (long)pSamplesOut[-0x16] * (long)coefficients[0x17];
      case 0x16:
        lVar22 = lVar22 + (long)pSamplesOut[-0x15] * (long)coefficients[0x16];
      case 0x15:
        lVar22 = lVar22 + (long)pSamplesOut[-0x14] * (long)coefficients[0x15];
      case 0x14:
        lVar22 = lVar22 + (long)pSamplesOut[-0x13] * (long)coefficients[0x14];
      case 0x13:
        lVar22 = lVar22 + (long)pSamplesOut[-0x12] * (long)coefficients[0x13];
      case 0x12:
        lVar22 = lVar22 + (long)pSamplesOut[-0x11] * (long)coefficients[0x12];
      case 0x11:
        lVar22 = lVar22 + (long)pSamplesOut[-0x10] * (long)coefficients[0x11];
      case 0x10:
        lVar22 = lVar22 + (long)pSamplesOut[-0xf] * (long)coefficients[0x10];
      case 0xf:
        lVar22 = lVar22 + (long)pSamplesOut[-0xe] * (long)coefficients[0xf];
      case 0xe:
        lVar22 = lVar22 + (long)pSamplesOut[-0xd] * (long)coefficients[0xe];
      case 0xd:
        lVar22 = lVar22 + (long)pSamplesOut[-0xc] * (long)coefficients[0xd];
      case 0xc:
        lVar22 = lVar22 + (long)pSamplesOut[-0xb] * (long)coefficients[0xc];
      case 0xb:
        lVar22 = lVar22 + (long)pSamplesOut[-10] * (long)coefficients[0xb];
      case 10:
        lVar22 = lVar22 + (long)pSamplesOut[-9] * (long)coefficients[10];
      case 9:
        lVar22 = lVar22 + (long)pSamplesOut[-8] * (long)coefficients[9];
      case 8:
        lVar22 = lVar22 + (long)pSamplesOut[-7] * (long)coefficients[8];
      case 7:
        lVar22 = lVar22 + (long)pSamplesOut[-6] * (long)coefficients[7];
      case 6:
        lVar22 = lVar22 + (long)pSamplesOut[-5] * (long)coefficients[6];
      case 5:
        lVar22 = lVar22 + (long)pSamplesOut[-4] * (long)coefficients[5];
      case 4:
        lVar22 = lVar22 + (long)pSamplesOut[-3] * (long)coefficients[4];
      case 3:
        lVar22 = lVar22 + (long)pSamplesOut[-2] * (long)coefficients[3];
      case 2:
        lVar22 = lVar22 + (long)pSamplesOut[-1] * (long)coefficients[2];
      case 1:
        lVar22 = lVar22 + (long)*pSamplesOut * (long)coefficients[1];
      case 0:
        lVar22 = lVar22 + (long)pSamplesOut[1] * (long)*coefficients;
      }
      pSamplesOut[2] = (int)(lVar22 >> (bVar11 & 0x3f)) + local_f0;
      lVar22 = 0;
      switch(iVar21) {
      case 0x1f:
        lVar22 = (long)pSamplesOut[-0x1d] * (long)coefficients[0x1f];
      case 0x1e:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1e];
      case 0x1d:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1d];
      case 0x1c:
        lVar22 = lVar22 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x1c];
      case 0x1b:
        lVar22 = lVar22 + (long)pSamplesOut[-0x19] * (long)coefficients[0x1b];
      case 0x1a:
        lVar22 = lVar22 + (long)pSamplesOut[-0x18] * (long)coefficients[0x1a];
      case 0x19:
        lVar22 = lVar22 + (long)pSamplesOut[-0x17] * (long)coefficients[0x19];
      case 0x18:
        lVar22 = lVar22 + (long)pSamplesOut[-0x16] * (long)coefficients[0x18];
      case 0x17:
        lVar22 = lVar22 + (long)pSamplesOut[-0x15] * (long)coefficients[0x17];
      case 0x16:
        lVar22 = lVar22 + (long)pSamplesOut[-0x14] * (long)coefficients[0x16];
      case 0x15:
        lVar22 = lVar22 + (long)pSamplesOut[-0x13] * (long)coefficients[0x15];
      case 0x14:
        lVar22 = lVar22 + (long)pSamplesOut[-0x12] * (long)coefficients[0x14];
      case 0x13:
        lVar22 = lVar22 + (long)pSamplesOut[-0x11] * (long)coefficients[0x13];
      case 0x12:
        lVar22 = lVar22 + (long)pSamplesOut[-0x10] * (long)coefficients[0x12];
      case 0x11:
        lVar22 = lVar22 + (long)pSamplesOut[-0xf] * (long)coefficients[0x11];
      case 0x10:
        lVar22 = lVar22 + (long)pSamplesOut[-0xe] * (long)coefficients[0x10];
      case 0xf:
        lVar22 = lVar22 + (long)pSamplesOut[-0xd] * (long)coefficients[0xf];
      case 0xe:
        lVar22 = lVar22 + (long)pSamplesOut[-0xc] * (long)coefficients[0xe];
      case 0xd:
        lVar22 = lVar22 + (long)pSamplesOut[-0xb] * (long)coefficients[0xd];
      case 0xc:
        lVar22 = lVar22 + (long)pSamplesOut[-10] * (long)coefficients[0xc];
      case 0xb:
        lVar22 = lVar22 + (long)pSamplesOut[-9] * (long)coefficients[0xb];
      case 10:
        lVar22 = lVar22 + (long)pSamplesOut[-8] * (long)coefficients[10];
      case 9:
        lVar22 = lVar22 + (long)pSamplesOut[-7] * (long)coefficients[9];
      case 8:
        lVar22 = lVar22 + (long)pSamplesOut[-6] * (long)coefficients[8];
      case 7:
        lVar22 = lVar22 + (long)pSamplesOut[-5] * (long)coefficients[7];
      case 6:
        lVar22 = lVar22 + (long)pSamplesOut[-4] * (long)coefficients[6];
      case 5:
        lVar22 = lVar22 + (long)pSamplesOut[-3] * (long)coefficients[5];
      case 4:
        lVar22 = lVar22 + (long)pSamplesOut[-2] * (long)coefficients[4];
      case 3:
        lVar22 = lVar22 + (long)pSamplesOut[-1] * (long)coefficients[3];
      case 2:
        lVar22 = lVar22 + (long)*pSamplesOut * (long)coefficients[2];
      case 1:
        lVar22 = lVar22 + (long)pSamplesOut[1] * (long)coefficients[1];
      case 0:
        lVar22 = lVar22 + (long)pSamplesOut[2] * (long)*coefficients;
      }
      pSamplesOut[3] = (int)(lVar22 >> (bVar11 & 0x3f)) + local_88;
      pSamplesOut = pSamplesOut + 4;
    } while (pSamplesOut < piVar1);
    goto LAB_0018fdcf;
  }
  local_100 = 0;
  local_120._0_4_ = 0;
LAB_0018fdcf:
  if (uVar30 != count) {
    iVar7 = riceParam + 1;
    uVar8 = 0x3f - riceParam;
    do {
      uVar27 = bs->cache;
      mVar26 = bs->consumedBits;
      if (ma_dr_flac__gIsLZCNTSupported == 0) {
        if (uVar27 == 0) {
          uVar39 = 0x40;
        }
        else {
          if (uVar27 < 0x1000000000000000) {
            bVar46 = uVar27 >> 0x20 == 0;
            uVar39 = uVar27 << 0x20;
            if (!bVar46) {
              uVar39 = uVar27;
            }
            iVar20 = (uint)bVar46 * 0x20;
            iVar21 = iVar20 + 0x10;
            uVar28 = uVar39 << 0x10;
            if (0xffffffffffff < uVar39) {
              iVar21 = iVar20;
              uVar28 = uVar39;
            }
            iVar20 = iVar21 + 8;
            uVar39 = uVar28 << 8;
            if (0xffffffffffffff < uVar28) {
              iVar20 = iVar21;
              uVar39 = uVar28;
            }
            iVar21 = iVar20 + 4;
            uVar28 = uVar39 << 4;
            if (0xfffffffffffffff < uVar39) {
              iVar21 = iVar20;
              uVar28 = uVar39;
            }
            iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (uVar28 >> 0x3c) * 4);
          }
          else {
            iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                             (uVar27 >> 0x3c) * 4);
          }
          uVar39 = (ulong)(iVar21 - 1);
        }
      }
      else {
        uVar39 = LZCOUNT(uVar27);
      }
      uVar42 = (uint)uVar39;
      if (uVar42 < 0x40) {
LAB_00190220:
        local_100 = uVar39;
        mVar44 = uVar27 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar26 + uVar42;
        if (uVar8 < uVar42) {
          uVar27 = mVar44 >> ((byte)uVar8 & 0x3f);
          uVar31 = uVar42 - uVar8;
          uVar30 = bs->nextL2Line;
          if ((ulong)uVar30 < 0x200) {
            mVar26 = bs->crc16CacheIgnoredBytes;
            if (mVar26 == 0) {
              mVar44 = bs->crc16Cache;
              uVar42 = (uint)(mVar44 >> 0x20);
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar42 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)(ushort)(mVar44 >> 0x30) ^
                                                             ((uint)bs->crc16 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                    << 8 ^ (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                  (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)(ushort)(mVar44 >> 0x30) ^
                                                          ((uint)bs->crc16 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)(ushort)(mVar44 >> 0x30
                                                                                     ) ^
                                                                      ((uint)bs->crc16 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(bs->crc16 >> 8)
                                                                             ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)(ushort)(mVar44 >> 0x30)
                                                                     ^ ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                          (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff]) >>
                            8 & 0xff ^ (uint)mVar44) & 0xff];
            }
            else {
              uVar17 = bs->crc16;
              uVar42 = (uint)uVar17;
              if (mVar26 - 1 < 7) {
                mVar44 = bs->crc16Cache;
                uVar23 = (uint)(mVar44 >> 0x20);
                switch(mVar26) {
                case 1:
                  uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]);
                case 2:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar23 ^ uVar42) >> 8 & 0xff]);
                case 3:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar23 ^ uVar42 >> 8) & 0xff]);
                case 4:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                case 5:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]);
                case 6:
                  uVar17 = (ushort)(uVar42 << 8) ^
                           ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                case 7:
                  uVar17 = uVar17 << 8 ^
                           ma_dr_flac__crc16_table
                           [((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                }
              }
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar30 + 1;
            uVar39 = bs->cacheL2[uVar30];
            mVar45 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                     (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                     (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                     (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38;
            bs->crc16Cache = mVar45;
            uVar42 = uVar31;
LAB_001904a8:
            mVar44 = mVar45 << ((byte)uVar31 & 0x3f);
            local_120._0_4_ = (uint)uVar27 | (uint)(mVar45 >> (-(byte)uVar31 & 0x3f));
            bVar46 = true;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
            }
            else {
              if ((ulong)uVar31 <= 0x40 - (ulong)bs->consumedBits) {
                mVar45 = bs->cache;
                uVar42 = bs->consumedBits + uVar31;
                goto LAB_001904a8;
              }
              bVar46 = false;
            }
          }
          bVar6 = true;
          if (!bVar46) goto LAB_001904e3;
        }
        else {
          local_120._0_4_ = (uint)(mVar44 >> ((byte)uVar8 & 0x3f));
          mVar44 = mVar44 << ((byte)iVar7 & 0x3f);
          uVar42 = uVar42 + iVar7;
        }
        bs->cache = mVar44;
        bs->consumedBits = uVar42;
        bVar6 = false;
      }
      else {
        uVar30 = 0x40 - mVar26;
        do {
          uVar42 = (uint)uVar39;
          uVar31 = bs->nextL2Line;
          if ((ulong)uVar31 < 0x200) {
            mVar26 = bs->crc16CacheIgnoredBytes;
            if (mVar26 == 0) {
              mVar44 = bs->crc16Cache;
              uVar42 = (uint)(mVar44 >> 0x20);
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar42 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)(ushort)(mVar44 >> 0x30) ^
                                                            ((uint)bs->crc16 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(bs->crc16 >> 8) ^
                                                                   (uint)(byte)(mVar44 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)(ushort)(mVar44 >>
                                                                                      0x30) ^
                                                                       ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)(ushort)(mVar44 >> 0x30) ^
                                                             ((uint)bs->crc16 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar42 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(bs->crc16 >> 8) ^
                                                                    (uint)(byte)(mVar44 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)(ushort)(mVar44 >>
                                                                                       0x30) ^
                                                                        ((uint)bs->crc16 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                    << 8 ^ (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                  (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)(ushort)(mVar44 >> 0x30) ^
                                                               ((uint)bs->crc16 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar42 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(bs->crc16 >> 8) ^
                                                                      (uint)(byte)(mVar44 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff
                                            ] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar42 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(bs->crc16 >> 8) ^
                                                            (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)(ushort)(mVar44 >> 0x30) ^
                                                           ((uint)bs->crc16 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)]) >>
                                                           8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)(ushort)(mVar44 
                                                  >> 0x30) ^
                                                  ((uint)bs->crc16 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(bs->crc16 >> 8) ^
                                                         (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                    (uint)(mVar44 >> 0x10) & 0xffff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(bs->crc16 >> 8) ^
                                                           (uint)(byte)(mVar44 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)(ushort)(mVar44 >> 0x30) ^
                                                          ((uint)bs->crc16 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)(ushort)(mVar44 >> 0x30
                                                                                     ) ^
                                                                      ((uint)bs->crc16 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(bs->crc16 >> 8)
                                                                             ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           (uint)(mVar44 >> 0x18) & 0xff] << 8 ^ (uint)mVar44 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)(ushort)(mVar44 >> 0x30)
                                                                     ^ ((uint)bs->crc16 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(bs->crc16 >> 8)
                                                                              ^ (uint)(byte)(mVar44 
                                                  >> 0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar42 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(bs->crc16 >> 8) ^
                                                                  (uint)(byte)(mVar44 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                   ((uint)bs->crc16 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(bs->crc16 >> 8) ^
                                                                          (uint)(byte)(mVar44 >>
                                                                                      0x38)]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)(ushort)(mVar44 >>
                                                                                          0x30) ^
                                                                           ((uint)bs->crc16 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(bs->crc16 >> 8) ^
                                                   (uint)(byte)(mVar44 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar42 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(bs->crc16 >> 8) ^
                                                                 (uint)(byte)(mVar44 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)(ushort)(mVar44 >> 0x30) ^
                                                                  ((uint)bs->crc16 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(bs->crc16 >> 8) ^
                                                                         (uint)(byte)(mVar44 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  (uint)(mVar44 >> 0x18) & 0xff]) >> 8 & 0xff ^
                                          (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]) >> 8 & 0xff]) >>
                            8 & 0xff ^ (uint)mVar44) & 0xff];
            }
            else {
              uVar17 = bs->crc16;
              uVar42 = (uint)uVar17;
              if (mVar26 - 1 < 7) {
                mVar44 = bs->crc16Cache;
                uVar23 = (uint)(mVar44 >> 0x20);
                switch(mVar26) {
                case 1:
                  uVar42 = (uint)(ushort)(uVar17 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)((ushort)(mVar44 >> 0x30) ^ uVar17 >> 8) & 0xff]);
                case 2:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar23 ^ uVar42) >> 8 & 0xff]);
                case 3:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar23 ^ uVar42 >> 8) & 0xff]);
                case 4:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [uVar42 >> 8 ^ (uint)(mVar44 >> 0x18) & 0xff]);
                case 5:
                  uVar42 = (uint)(ushort)((ushort)(uVar42 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar42 >> 8 ^ (uint)(mVar44 >> 0x10) & 0xffff) & 0xff]);
                case 6:
                  uVar17 = (ushort)(uVar42 << 8) ^
                           ma_dr_flac__crc16_table[((uint)mVar44 ^ uVar42) >> 8 & 0xff];
                case 7:
                  uVar17 = uVar17 << 8 ^
                           ma_dr_flac__crc16_table
                           [(ulong)((uint)mVar44 ^ (uint)(byte)(uVar17 >> 8)) & 0xff];
                }
              }
              bs->crc16 = uVar17;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar31 + 1;
            uVar27 = bs->cacheL2[uVar31];
            uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            bs->crc16Cache = uVar27;
            mVar26 = 0;
          }
          else {
            mVar10 = ma_dr_flac__reload_cache(bs);
            if (mVar10 == 0) {
              bVar46 = false;
              goto LAB_0019020c;
            }
            uVar27 = bs->cache;
            mVar26 = bs->consumedBits;
          }
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            if (uVar27 == 0) {
              uVar39 = 0x40;
            }
            else {
              if (uVar27 < 0x1000000000000000) {
                bVar46 = uVar27 >> 0x20 == 0;
                uVar39 = uVar27 << 0x20;
                if (!bVar46) {
                  uVar39 = uVar27;
                }
                iVar20 = (uint)bVar46 * 0x20;
                iVar21 = iVar20 + 0x10;
                uVar28 = uVar39 << 0x10;
                if (0xffffffffffff < uVar39) {
                  iVar21 = iVar20;
                  uVar28 = uVar39;
                }
                iVar20 = iVar21 + 8;
                uVar39 = uVar28 << 8;
                if (0xffffffffffffff < uVar28) {
                  iVar20 = iVar21;
                  uVar39 = uVar28;
                }
                iVar21 = iVar20 + 4;
                uVar28 = uVar39 << 4;
                if (0xfffffffffffffff < uVar39) {
                  iVar21 = iVar20;
                  uVar28 = uVar39;
                }
                iVar21 = iVar21 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar28 >> 0x3c) * 4);
              }
              else {
                iVar21 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                 (uVar27 >> 0x3c) * 4);
              }
              uVar39 = (ulong)(iVar21 - 1);
            }
          }
          else {
            uVar39 = LZCOUNT(uVar27);
          }
          uVar42 = (uint)uVar39;
          uVar30 = uVar30 + uVar42;
        } while (0x3f < uVar42);
        bVar46 = true;
        local_100 = (ulong)uVar30;
LAB_0019020c:
        bVar6 = true;
        uVar39 = local_100;
        if (bVar46) goto LAB_00190220;
      }
LAB_001904e3:
      if (bVar6) {
        return 0;
      }
      uVar30 = (int)local_100 << (riceParam & 0x1f) | (uint)local_120 & uVar35;
      uVar27 = (ulong)lpcOrder;
      uVar42 = bitsPerSample + lpcPrecision;
      do {
        uVar42 = uVar42 + 1;
        uVar31 = (uint)uVar27;
        uVar27 = uVar27 >> 1;
      } while (1 < uVar31);
      lVar22 = 0;
      iVar21 = 0;
      if (uVar42 < 0x21) {
        switch(lpcOrder) {
        case 0x20:
          iVar21 = pSamplesOut[-0x20] * coefficients[0x1f];
        case 0x1f:
          iVar21 = iVar21 + pSamplesOut[-0x1f] * coefficients[0x1e];
        case 0x1e:
          iVar21 = iVar21 + pSamplesOut[-0x1e] * coefficients[0x1d];
        case 0x1d:
          iVar21 = iVar21 + pSamplesOut[-0x1d] * coefficients[0x1c];
        case 0x1c:
          iVar21 = iVar21 + pSamplesOut[-0x1c] * coefficients[0x1b];
        case 0x1b:
          iVar21 = iVar21 + pSamplesOut[-0x1b] * coefficients[0x1a];
        case 0x1a:
          iVar21 = iVar21 + pSamplesOut[-0x1a] * coefficients[0x19];
        case 0x19:
          iVar21 = iVar21 + pSamplesOut[-0x19] * coefficients[0x18];
        case 0x18:
          iVar21 = iVar21 + pSamplesOut[-0x18] * coefficients[0x17];
        case 0x17:
          iVar21 = iVar21 + pSamplesOut[-0x17] * coefficients[0x16];
        case 0x16:
          iVar21 = iVar21 + pSamplesOut[-0x16] * coefficients[0x15];
        case 0x15:
          iVar21 = iVar21 + pSamplesOut[-0x15] * coefficients[0x14];
        case 0x14:
          iVar21 = iVar21 + pSamplesOut[-0x14] * coefficients[0x13];
        case 0x13:
          iVar21 = iVar21 + pSamplesOut[-0x13] * coefficients[0x12];
        case 0x12:
          iVar21 = iVar21 + pSamplesOut[-0x12] * coefficients[0x11];
        case 0x11:
          iVar21 = iVar21 + pSamplesOut[-0x11] * coefficients[0x10];
        case 0x10:
          iVar21 = iVar21 + pSamplesOut[-0x10] * coefficients[0xf];
        case 0xf:
          iVar21 = iVar21 + pSamplesOut[-0xf] * coefficients[0xe];
        case 0xe:
          iVar21 = iVar21 + pSamplesOut[-0xe] * coefficients[0xd];
        case 0xd:
          iVar21 = iVar21 + pSamplesOut[-0xd] * coefficients[0xc];
        case 0xc:
          iVar21 = iVar21 + pSamplesOut[-0xc] * coefficients[0xb];
        case 0xb:
          iVar21 = iVar21 + pSamplesOut[-0xb] * coefficients[10];
        case 10:
          iVar21 = iVar21 + pSamplesOut[-10] * coefficients[9];
        case 9:
          iVar21 = iVar21 + pSamplesOut[-9] * coefficients[8];
        case 8:
          iVar21 = iVar21 + pSamplesOut[-8] * coefficients[7];
        case 7:
          iVar21 = iVar21 + pSamplesOut[-7] * coefficients[6];
        case 6:
          iVar21 = iVar21 + pSamplesOut[-6] * coefficients[5];
        case 5:
          iVar21 = iVar21 + pSamplesOut[-5] * coefficients[4];
        case 4:
          iVar21 = iVar21 + pSamplesOut[-4] * coefficients[3];
        case 3:
          iVar21 = iVar21 + pSamplesOut[-3] * coefficients[2];
        case 2:
          iVar21 = iVar21 + pSamplesOut[-2] * coefficients[1];
        case 1:
          iVar21 = iVar21 + pSamplesOut[-1] * *coefficients;
        default:
          iVar21 = iVar21 >> (bVar11 & 0x1f);
        }
      }
      else {
        switch(lpcOrder) {
        case 0x20:
          lVar22 = (long)pSamplesOut[-0x20] * (long)coefficients[0x1f];
        case 0x1f:
          lVar22 = lVar22 + (long)pSamplesOut[-0x1f] * (long)coefficients[0x1e];
        case 0x1e:
          lVar22 = lVar22 + (long)pSamplesOut[-0x1e] * (long)coefficients[0x1d];
        case 0x1d:
          lVar22 = lVar22 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1c];
        case 0x1c:
          lVar22 = lVar22 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1b];
        case 0x1b:
          lVar22 = lVar22 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1a];
        case 0x1a:
          lVar22 = lVar22 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x19];
        case 0x19:
          lVar22 = lVar22 + (long)pSamplesOut[-0x19] * (long)coefficients[0x18];
        case 0x18:
          lVar22 = lVar22 + (long)pSamplesOut[-0x18] * (long)coefficients[0x17];
        case 0x17:
          lVar22 = lVar22 + (long)pSamplesOut[-0x17] * (long)coefficients[0x16];
        case 0x16:
          lVar22 = lVar22 + (long)pSamplesOut[-0x16] * (long)coefficients[0x15];
        case 0x15:
          lVar22 = lVar22 + (long)pSamplesOut[-0x15] * (long)coefficients[0x14];
        case 0x14:
          lVar22 = lVar22 + (long)pSamplesOut[-0x14] * (long)coefficients[0x13];
        case 0x13:
          lVar22 = lVar22 + (long)pSamplesOut[-0x13] * (long)coefficients[0x12];
        case 0x12:
          lVar22 = lVar22 + (long)pSamplesOut[-0x12] * (long)coefficients[0x11];
        case 0x11:
          lVar22 = lVar22 + (long)pSamplesOut[-0x11] * (long)coefficients[0x10];
        case 0x10:
          lVar22 = lVar22 + (long)pSamplesOut[-0x10] * (long)coefficients[0xf];
        case 0xf:
          lVar22 = lVar22 + (long)pSamplesOut[-0xf] * (long)coefficients[0xe];
        case 0xe:
          lVar22 = lVar22 + (long)pSamplesOut[-0xe] * (long)coefficients[0xd];
        case 0xd:
          lVar22 = lVar22 + (long)pSamplesOut[-0xd] * (long)coefficients[0xc];
        case 0xc:
          lVar22 = lVar22 + (long)pSamplesOut[-0xc] * (long)coefficients[0xb];
        case 0xb:
          lVar22 = lVar22 + (long)pSamplesOut[-0xb] * (long)coefficients[10];
        case 10:
          lVar22 = lVar22 + (long)pSamplesOut[-10] * (long)coefficients[9];
        case 9:
          lVar22 = lVar22 + (long)pSamplesOut[-9] * (long)coefficients[8];
        case 8:
          lVar22 = lVar22 + (long)pSamplesOut[-8] * (long)coefficients[7];
        case 7:
          lVar22 = lVar22 + (long)pSamplesOut[-7] * (long)coefficients[6];
        case 6:
          lVar22 = lVar22 + (long)pSamplesOut[-6] * (long)coefficients[5];
        case 5:
          lVar22 = lVar22 + (long)pSamplesOut[-5] * (long)coefficients[4];
        case 4:
          lVar22 = lVar22 + (long)pSamplesOut[-4] * (long)coefficients[3];
        case 3:
          lVar22 = lVar22 + (long)pSamplesOut[-3] * (long)coefficients[2];
        case 2:
          lVar22 = lVar22 + (long)pSamplesOut[-2] * (long)coefficients[1];
        case 1:
          lVar22 = lVar22 + (long)pSamplesOut[-1] * (long)*coefficients;
        default:
          iVar21 = (int)(lVar22 >> (bVar11 & 0x3f));
        }
      }
      local_120._0_4_ = *(uint *)(&DAT_0019dc58 + (ulong)(uVar30 & 1) * 4) ^ uVar30 >> 1;
      *pSamplesOut = iVar21 + (uint)local_120;
      uVar42 = (int)local_70 + 1;
      local_70 = (ulong)uVar42;
      pSamplesOut = pSamplesOut + 1;
    } while (uVar42 < count);
  }
  return 1;
}

Assistant:

static ma_bool32 ma_dr_flac__decode_samples_with_residual__rice__scalar(ma_dr_flac_bs* bs, ma_uint32 bitsPerSample, ma_uint32 count, ma_uint8 riceParam, ma_uint32 lpcOrder, ma_int32 lpcShift, ma_uint32 lpcPrecision, const ma_int32* coefficients, ma_int32* pSamplesOut)
{
    ma_uint32 t[2] = {0x00000000, 0xFFFFFFFF};
    ma_uint32 zeroCountPart0 = 0;
    ma_uint32 zeroCountPart1 = 0;
    ma_uint32 zeroCountPart2 = 0;
    ma_uint32 zeroCountPart3 = 0;
    ma_uint32 riceParamPart0 = 0;
    ma_uint32 riceParamPart1 = 0;
    ma_uint32 riceParamPart2 = 0;
    ma_uint32 riceParamPart3 = 0;
    ma_uint32 riceParamMask;
    const ma_int32* pSamplesOutEnd;
    ma_uint32 i;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pSamplesOut != NULL);
    if (lpcOrder == 0) {
        return ma_dr_flac__decode_samples_with_residual__rice__scalar_zeroorder(bs, bitsPerSample, count, riceParam, lpcOrder, lpcShift, coefficients, pSamplesOut);
    }
    riceParamMask  = (ma_uint32)~((~0UL) << riceParam);
    pSamplesOutEnd = pSamplesOut + (count & ~3);
    if (ma_dr_flac__use_64_bit_prediction(bitsPerSample, lpcOrder, lpcPrecision)) {
        while (pSamplesOut < pSamplesOutEnd) {
            if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart1, &riceParamPart1) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart2, &riceParamPart2) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart3, &riceParamPart3)) {
                return MA_FALSE;
            }
            riceParamPart0 &= riceParamMask;
            riceParamPart1 &= riceParamMask;
            riceParamPart2 &= riceParamMask;
            riceParamPart3 &= riceParamMask;
            riceParamPart0 |= (zeroCountPart0 << riceParam);
            riceParamPart1 |= (zeroCountPart1 << riceParam);
            riceParamPart2 |= (zeroCountPart2 << riceParam);
            riceParamPart3 |= (zeroCountPart3 << riceParam);
            riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
            riceParamPart1  = (riceParamPart1 >> 1) ^ t[riceParamPart1 & 0x01];
            riceParamPart2  = (riceParamPart2 >> 1) ^ t[riceParamPart2 & 0x01];
            riceParamPart3  = (riceParamPart3 >> 1) ^ t[riceParamPart3 & 0x01];
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
            pSamplesOut[1] = riceParamPart1 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 1);
            pSamplesOut[2] = riceParamPart2 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 2);
            pSamplesOut[3] = riceParamPart3 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 3);
            pSamplesOut += 4;
        }
    } else {
        while (pSamplesOut < pSamplesOutEnd) {
            if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart1, &riceParamPart1) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart2, &riceParamPart2) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart3, &riceParamPart3)) {
                return MA_FALSE;
            }
            riceParamPart0 &= riceParamMask;
            riceParamPart1 &= riceParamMask;
            riceParamPart2 &= riceParamMask;
            riceParamPart3 &= riceParamMask;
            riceParamPart0 |= (zeroCountPart0 << riceParam);
            riceParamPart1 |= (zeroCountPart1 << riceParam);
            riceParamPart2 |= (zeroCountPart2 << riceParam);
            riceParamPart3 |= (zeroCountPart3 << riceParam);
            riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
            riceParamPart1  = (riceParamPart1 >> 1) ^ t[riceParamPart1 & 0x01];
            riceParamPart2  = (riceParamPart2 >> 1) ^ t[riceParamPart2 & 0x01];
            riceParamPart3  = (riceParamPart3 >> 1) ^ t[riceParamPart3 & 0x01];
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
            pSamplesOut[1] = riceParamPart1 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 1);
            pSamplesOut[2] = riceParamPart2 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 2);
            pSamplesOut[3] = riceParamPart3 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 3);
            pSamplesOut += 4;
        }
    }
    i = (count & ~3);
    while (i < count) {
        if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0)) {
            return MA_FALSE;
        }
        riceParamPart0 &= riceParamMask;
        riceParamPart0 |= (zeroCountPart0 << riceParam);
        riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
        if (ma_dr_flac__use_64_bit_prediction(bitsPerSample, lpcOrder, lpcPrecision)) {
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
        } else {
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
        }
        i += 1;
        pSamplesOut += 1;
    }
    return MA_TRUE;
}